

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiIntersectorK<8,4>::
     occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Primitive PVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int iVar17;
  long lVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  uint uVar92;
  undefined1 (*pauVar93) [32];
  uint uVar94;
  uint uVar95;
  int iVar96;
  ulong uVar97;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  ulong uVar98;
  bool bVar99;
  bool bVar100;
  byte bVar101;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar102;
  undefined4 uVar103;
  float fVar104;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar130;
  float fVar132;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar117 [32];
  float fVar131;
  float fVar133;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar116 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar137 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar138 [16];
  undefined1 auVar150 [32];
  undefined1 auVar142 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar139 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [64];
  float fVar155;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar182;
  float fVar183;
  undefined1 auVar171 [32];
  float fVar184;
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar162 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar170 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar195 [16];
  undefined1 auVar203 [32];
  float fVar204;
  float fVar218;
  float fVar221;
  float fVar224;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar216;
  float fVar219;
  float fVar222;
  undefined1 auVar213 [32];
  float fVar217;
  float fVar220;
  float fVar223;
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar235 [16];
  undefined8 uVar234;
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [64];
  float fVar253;
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  float fVar254;
  undefined1 auVar255 [16];
  float fVar259;
  float fVar260;
  float fVar262;
  float fVar263;
  float fVar264;
  undefined1 auVar256 [32];
  float fVar261;
  undefined1 auVar257 [32];
  undefined1 auVar258 [64];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  float fVar269;
  undefined1 in_ZMM10 [64];
  undefined1 auVar268 [64];
  float fVar270;
  undefined1 auVar272 [64];
  undefined1 auVar273 [16];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  undefined1 auVar282 [32];
  undefined1 auVar287 [16];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_be8;
  float fStack_b5c;
  float fStack_b58;
  float fStack_b54;
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  RTCFilterFunctionNArguments local_ab0;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  undefined1 local_a60 [32];
  undefined1 local_a40 [28];
  uint uStack_a24;
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [32];
  undefined1 local_8d0 [16];
  undefined1 local_8c0 [16];
  Primitive *local_8b0;
  ulong local_8a8;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  uint local_760;
  uint uStack_75c;
  uint uStack_758;
  uint uStack_754;
  uint local_750;
  uint uStack_74c;
  uint uStack_748;
  uint uStack_744;
  RTCHitN local_740 [16];
  undefined1 auStack_730 [16];
  undefined4 local_720;
  undefined4 uStack_71c;
  undefined4 uStack_718;
  undefined4 uStack_714;
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6e0 [16];
  uint local_6d0;
  uint uStack_6cc;
  uint uStack_6c8;
  uint uStack_6c4;
  uint uStack_6c0;
  uint uStack_6bc;
  uint uStack_6b8;
  uint uStack_6b4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  uint local_660;
  uint uStack_65c;
  uint uStack_658;
  uint uStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  uint uStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined4 local_520;
  undefined4 uStack_51c;
  undefined4 uStack_518;
  undefined4 uStack_514;
  undefined4 uStack_510;
  undefined4 uStack_50c;
  undefined4 uStack_508;
  undefined4 uStack_504;
  undefined4 local_500;
  undefined4 uStack_4fc;
  undefined4 uStack_4f8;
  undefined4 uStack_4f4;
  undefined4 uStack_4f0;
  undefined4 uStack_4ec;
  undefined4 uStack_4e8;
  undefined4 uStack_4e4;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined1 local_260 [32];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar265 [16];
  undefined1 auVar271 [16];
  undefined1 auVar277 [64];
  
  PVar6 = prim[1];
  uVar98 = (ulong)(byte)PVar6;
  fVar102 = *(float *)(prim + uVar98 * 0x19 + 0x12);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar9 = vsubps_avx(auVar9,*(undefined1 (*) [16])(prim + uVar98 * 0x19 + 6));
  auVar112._0_4_ = fVar102 * auVar9._0_4_;
  auVar112._4_4_ = fVar102 * auVar9._4_4_;
  auVar112._8_4_ = fVar102 * auVar9._8_4_;
  auVar112._12_4_ = fVar102 * auVar9._12_4_;
  auVar106._0_4_ = fVar102 * auVar10._0_4_;
  auVar106._4_4_ = fVar102 * auVar10._4_4_;
  auVar106._8_4_ = fVar102 * auVar10._8_4_;
  auVar106._12_4_ = fVar102 * auVar10._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar98 * 4 + 6);
  auVar117 = vpmovsxbd_avx2(auVar9);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar98 * 5 + 6);
  auVar150 = vpmovsxbd_avx2(auVar10);
  auVar150 = vcvtdq2ps_avx(auVar150);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + uVar98 * 6 + 6);
  auVar13 = vpmovsxbd_avx2(auVar1);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + uVar98 * 0xb + 6);
  auVar14 = vpmovsxbd_avx2(auVar2);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6);
  auVar15 = vpmovsxbd_avx2(auVar3);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + (uint)(byte)PVar6 * 0xc + uVar98 + 6);
  auVar122 = vpmovsxbd_avx2(auVar4);
  auVar122 = vcvtdq2ps_avx(auVar122);
  uVar97 = (ulong)(uint)((int)(uVar98 * 9) * 2);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar97 + 6);
  auVar147 = vpmovsxbd_avx2(auVar5);
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *(ulong *)(prim + uVar97 + uVar98 + 6);
  auVar249 = vpmovsxbd_avx2(auVar110);
  auVar249 = vcvtdq2ps_avx(auVar249);
  uVar97 = (ulong)(uint)((int)(uVar98 * 5) << 2);
  auVar287._8_8_ = 0;
  auVar287._0_8_ = *(ulong *)(prim + uVar97 + 6);
  auVar16 = vpmovsxbd_avx2(auVar287);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar282._4_4_ = auVar106._0_4_;
  auVar282._0_4_ = auVar106._0_4_;
  auVar282._8_4_ = auVar106._0_4_;
  auVar282._12_4_ = auVar106._0_4_;
  auVar282._16_4_ = auVar106._0_4_;
  auVar282._20_4_ = auVar106._0_4_;
  auVar282._24_4_ = auVar106._0_4_;
  auVar282._28_4_ = auVar106._0_4_;
  auVar9 = vmovshdup_avx(auVar106);
  uVar234 = auVar9._0_8_;
  auVar288._8_8_ = uVar234;
  auVar288._0_8_ = uVar234;
  auVar288._16_8_ = uVar234;
  auVar288._24_8_ = uVar234;
  auVar9 = vshufps_avx(auVar106,auVar106,0xaa);
  fVar102 = auVar9._0_4_;
  auVar258._0_4_ = fVar102 * auVar13._0_4_;
  fVar130 = auVar9._4_4_;
  auVar258._4_4_ = fVar130 * auVar13._4_4_;
  auVar258._8_4_ = fVar102 * auVar13._8_4_;
  auVar258._12_4_ = fVar130 * auVar13._12_4_;
  auVar258._16_4_ = fVar102 * auVar13._16_4_;
  auVar258._20_4_ = fVar130 * auVar13._20_4_;
  auVar258._28_36_ = in_ZMM12._28_36_;
  auVar258._24_4_ = fVar102 * auVar13._24_4_;
  auVar241._0_4_ = auVar122._0_4_ * fVar102;
  auVar241._4_4_ = auVar122._4_4_ * fVar130;
  auVar241._8_4_ = auVar122._8_4_ * fVar102;
  auVar241._12_4_ = auVar122._12_4_ * fVar130;
  auVar241._16_4_ = auVar122._16_4_ * fVar102;
  auVar241._20_4_ = auVar122._20_4_ * fVar130;
  auVar241._28_36_ = in_ZMM10._28_36_;
  auVar241._24_4_ = auVar122._24_4_ * fVar102;
  auVar256._0_4_ = auVar16._0_4_ * fVar102;
  auVar256._4_4_ = auVar16._4_4_ * fVar130;
  auVar256._8_4_ = auVar16._8_4_ * fVar102;
  auVar256._12_4_ = auVar16._12_4_ * fVar130;
  auVar256._16_4_ = auVar16._16_4_ * fVar102;
  auVar256._20_4_ = auVar16._20_4_ * fVar130;
  auVar256._24_4_ = auVar16._24_4_ * fVar102;
  auVar256._28_4_ = 0;
  auVar9 = vfmadd231ps_fma(auVar258._0_32_,auVar288,auVar150);
  auVar10 = vfmadd231ps_fma(auVar241._0_32_,auVar288,auVar15);
  auVar1 = vfmadd231ps_fma(auVar256,auVar249,auVar288);
  auVar2 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar282,auVar117);
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar282,auVar14);
  auVar1 = vfmadd231ps_fma(ZEXT1632(auVar1),auVar147,auVar282);
  auVar238._4_4_ = auVar112._0_4_;
  auVar238._0_4_ = auVar112._0_4_;
  auVar238._8_4_ = auVar112._0_4_;
  auVar238._12_4_ = auVar112._0_4_;
  auVar238._16_4_ = auVar112._0_4_;
  auVar238._20_4_ = auVar112._0_4_;
  auVar238._24_4_ = auVar112._0_4_;
  auVar238._28_4_ = auVar112._0_4_;
  auVar9 = vmovshdup_avx(auVar112);
  uVar234 = auVar9._0_8_;
  auVar289._8_8_ = uVar234;
  auVar289._0_8_ = uVar234;
  auVar289._16_8_ = uVar234;
  auVar289._24_8_ = uVar234;
  auVar9 = vshufps_avx(auVar112,auVar112,0xaa);
  fVar102 = auVar9._0_4_;
  auVar237._0_4_ = fVar102 * auVar13._0_4_;
  fVar130 = auVar9._4_4_;
  auVar237._4_4_ = fVar130 * auVar13._4_4_;
  auVar237._8_4_ = fVar102 * auVar13._8_4_;
  auVar237._12_4_ = fVar130 * auVar13._12_4_;
  auVar237._16_4_ = fVar102 * auVar13._16_4_;
  auVar237._20_4_ = fVar130 * auVar13._20_4_;
  auVar237._24_4_ = fVar102 * auVar13._24_4_;
  auVar237._28_4_ = 0;
  auVar11._4_4_ = auVar122._4_4_ * fVar130;
  auVar11._0_4_ = auVar122._0_4_ * fVar102;
  auVar11._8_4_ = auVar122._8_4_ * fVar102;
  auVar11._12_4_ = auVar122._12_4_ * fVar130;
  auVar11._16_4_ = auVar122._16_4_ * fVar102;
  auVar11._20_4_ = auVar122._20_4_ * fVar130;
  auVar11._24_4_ = auVar122._24_4_ * fVar102;
  auVar11._28_4_ = auVar13._28_4_;
  auVar13._4_4_ = auVar16._4_4_ * fVar130;
  auVar13._0_4_ = auVar16._0_4_ * fVar102;
  auVar13._8_4_ = auVar16._8_4_ * fVar102;
  auVar13._12_4_ = auVar16._12_4_ * fVar130;
  auVar13._16_4_ = auVar16._16_4_ * fVar102;
  auVar13._20_4_ = auVar16._20_4_ * fVar130;
  auVar13._24_4_ = auVar16._24_4_ * fVar102;
  auVar13._28_4_ = fVar130;
  auVar9 = vfmadd231ps_fma(auVar237,auVar289,auVar150);
  auVar3 = vfmadd231ps_fma(auVar11,auVar289,auVar15);
  auVar4 = vfmadd231ps_fma(auVar13,auVar289,auVar249);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar238,auVar117);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar238,auVar14);
  local_860._8_4_ = 0x7fffffff;
  local_860._0_8_ = 0x7fffffff7fffffff;
  local_860._12_4_ = 0x7fffffff;
  local_860._16_4_ = 0x7fffffff;
  local_860._20_4_ = 0x7fffffff;
  local_860._24_4_ = 0x7fffffff;
  local_860._28_4_ = 0x7fffffff;
  auVar172._8_4_ = 0x219392ef;
  auVar172._0_8_ = 0x219392ef219392ef;
  auVar172._12_4_ = 0x219392ef;
  auVar172._16_4_ = 0x219392ef;
  auVar172._20_4_ = 0x219392ef;
  auVar172._24_4_ = 0x219392ef;
  auVar172._28_4_ = 0x219392ef;
  auVar117 = vandps_avx(ZEXT1632(auVar2),local_860);
  auVar117 = vcmpps_avx(auVar117,auVar172,1);
  auVar150 = vblendvps_avx(ZEXT1632(auVar2),auVar172,auVar117);
  auVar117 = vandps_avx(ZEXT1632(auVar10),local_860);
  auVar117 = vcmpps_avx(auVar117,auVar172,1);
  auVar13 = vblendvps_avx(ZEXT1632(auVar10),auVar172,auVar117);
  auVar117 = vandps_avx(ZEXT1632(auVar1),local_860);
  auVar117 = vcmpps_avx(auVar117,auVar172,1);
  auVar117 = vblendvps_avx(ZEXT1632(auVar1),auVar172,auVar117);
  auVar2 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar238,auVar147);
  auVar14 = vrcpps_avx(auVar150);
  auVar230._8_4_ = 0x3f800000;
  auVar230._0_8_ = 0x3f8000003f800000;
  auVar230._12_4_ = 0x3f800000;
  auVar230._16_4_ = 0x3f800000;
  auVar230._20_4_ = 0x3f800000;
  auVar230._24_4_ = 0x3f800000;
  auVar230._28_4_ = 0x3f800000;
  auVar9 = vfnmadd213ps_fma(auVar150,auVar14,auVar230);
  auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar14,auVar14);
  auVar150 = vrcpps_avx(auVar13);
  auVar10 = vfnmadd213ps_fma(auVar13,auVar150,auVar230);
  auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar150,auVar150);
  auVar150 = vrcpps_avx(auVar117);
  auVar1 = vfnmadd213ps_fma(auVar117,auVar150,auVar230);
  auVar1 = vfmadd132ps_fma(ZEXT1632(auVar1),auVar150,auVar150);
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar98 * 7 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar5));
  auVar14._4_4_ = auVar9._4_4_ * auVar117._4_4_;
  auVar14._0_4_ = auVar9._0_4_ * auVar117._0_4_;
  auVar14._8_4_ = auVar9._8_4_ * auVar117._8_4_;
  auVar14._12_4_ = auVar9._12_4_ * auVar117._12_4_;
  auVar14._16_4_ = auVar117._16_4_ * 0.0;
  auVar14._20_4_ = auVar117._20_4_ * 0.0;
  auVar14._24_4_ = auVar117._24_4_ * 0.0;
  auVar14._28_4_ = auVar117._28_4_;
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar98 * 9 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar5));
  auVar15._4_4_ = auVar9._4_4_ * auVar117._4_4_;
  auVar15._0_4_ = auVar9._0_4_ * auVar117._0_4_;
  auVar15._8_4_ = auVar9._8_4_ * auVar117._8_4_;
  auVar15._12_4_ = auVar9._12_4_ * auVar117._12_4_;
  auVar15._16_4_ = auVar117._16_4_ * 0.0;
  auVar15._20_4_ = auVar117._20_4_ * 0.0;
  auVar15._24_4_ = auVar117._24_4_ * 0.0;
  auVar15._28_4_ = auVar117._28_4_;
  auVar143._1_3_ = 0;
  auVar143[0] = PVar6;
  auVar150 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar6 * 0x10 + 6));
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar6 * 0x10 + uVar98 * -2 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar3));
  auVar122._4_4_ = auVar117._4_4_ * auVar10._4_4_;
  auVar122._0_4_ = auVar117._0_4_ * auVar10._0_4_;
  auVar122._8_4_ = auVar117._8_4_ * auVar10._8_4_;
  auVar122._12_4_ = auVar117._12_4_ * auVar10._12_4_;
  auVar122._16_4_ = auVar117._16_4_ * 0.0;
  auVar122._20_4_ = auVar117._20_4_ * 0.0;
  auVar122._24_4_ = auVar117._24_4_ * 0.0;
  auVar122._28_4_ = auVar117._28_4_;
  auVar117 = vcvtdq2ps_avx(auVar150);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar3));
  auVar147._4_4_ = auVar10._4_4_ * auVar117._4_4_;
  auVar147._0_4_ = auVar10._0_4_ * auVar117._0_4_;
  auVar147._8_4_ = auVar10._8_4_ * auVar117._8_4_;
  auVar147._12_4_ = auVar10._12_4_ * auVar117._12_4_;
  auVar147._16_4_ = auVar117._16_4_ * 0.0;
  auVar147._20_4_ = auVar117._20_4_ * 0.0;
  auVar147._24_4_ = auVar117._24_4_ * 0.0;
  auVar147._28_4_ = auVar117._28_4_;
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 + uVar98 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar2));
  auVar249._4_4_ = auVar117._4_4_ * auVar1._4_4_;
  auVar249._0_4_ = auVar117._0_4_ * auVar1._0_4_;
  auVar249._8_4_ = auVar117._8_4_ * auVar1._8_4_;
  auVar249._12_4_ = auVar117._12_4_ * auVar1._12_4_;
  auVar249._16_4_ = auVar117._16_4_ * 0.0;
  auVar249._20_4_ = auVar117._20_4_ * 0.0;
  auVar249._24_4_ = auVar117._24_4_ * 0.0;
  auVar249._28_4_ = auVar117._28_4_;
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar98 * 0x17 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar2));
  auVar16._4_4_ = auVar1._4_4_ * auVar117._4_4_;
  auVar16._0_4_ = auVar1._0_4_ * auVar117._0_4_;
  auVar16._8_4_ = auVar1._8_4_ * auVar117._8_4_;
  auVar16._12_4_ = auVar1._12_4_ * auVar117._12_4_;
  auVar16._16_4_ = auVar117._16_4_ * 0.0;
  auVar16._20_4_ = auVar117._20_4_ * 0.0;
  auVar16._24_4_ = auVar117._24_4_ * 0.0;
  auVar16._28_4_ = auVar117._28_4_;
  auVar117 = vpminsd_avx2(auVar14,auVar15);
  auVar150 = vpminsd_avx2(auVar122,auVar147);
  auVar117 = vmaxps_avx(auVar117,auVar150);
  uVar103 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar118._4_4_ = uVar103;
  auVar118._0_4_ = uVar103;
  auVar118._8_4_ = uVar103;
  auVar118._12_4_ = uVar103;
  auVar118._16_4_ = uVar103;
  auVar118._20_4_ = uVar103;
  auVar118._24_4_ = uVar103;
  auVar118._28_4_ = uVar103;
  auVar150 = vpminsd_avx2(auVar249,auVar16);
  auVar150 = vmaxps_avx(auVar150,auVar118);
  auVar117 = vmaxps_avx(auVar117,auVar150);
  local_320._4_4_ = auVar117._4_4_ * 0.99999964;
  local_320._0_4_ = auVar117._0_4_ * 0.99999964;
  local_320._8_4_ = auVar117._8_4_ * 0.99999964;
  local_320._12_4_ = auVar117._12_4_ * 0.99999964;
  local_320._16_4_ = auVar117._16_4_ * 0.99999964;
  local_320._20_4_ = auVar117._20_4_ * 0.99999964;
  local_320._24_4_ = auVar117._24_4_ * 0.99999964;
  local_320._28_4_ = auVar150._28_4_;
  auVar117 = vpmaxsd_avx2(auVar14,auVar15);
  auVar150 = vpmaxsd_avx2(auVar122,auVar147);
  auVar117 = vminps_avx(auVar117,auVar150);
  auVar150 = vpmaxsd_avx2(auVar249,auVar16);
  uVar103 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar171._4_4_ = uVar103;
  auVar171._0_4_ = uVar103;
  auVar171._8_4_ = uVar103;
  auVar171._12_4_ = uVar103;
  auVar171._16_4_ = uVar103;
  auVar171._20_4_ = uVar103;
  auVar171._24_4_ = uVar103;
  auVar171._28_4_ = uVar103;
  auVar150 = vminps_avx(auVar150,auVar171);
  auVar117 = vminps_avx(auVar117,auVar150);
  auVar12._4_4_ = auVar117._4_4_ * 1.0000004;
  auVar12._0_4_ = auVar117._0_4_ * 1.0000004;
  auVar12._8_4_ = auVar117._8_4_ * 1.0000004;
  auVar12._12_4_ = auVar117._12_4_ * 1.0000004;
  auVar12._16_4_ = auVar117._16_4_ * 1.0000004;
  auVar12._20_4_ = auVar117._20_4_ * 1.0000004;
  auVar12._24_4_ = auVar117._24_4_ * 1.0000004;
  auVar12._28_4_ = auVar117._28_4_;
  auVar143[4] = PVar6;
  auVar143._5_3_ = 0;
  auVar143[8] = PVar6;
  auVar143._9_3_ = 0;
  auVar143[0xc] = PVar6;
  auVar143._13_3_ = 0;
  auVar143[0x10] = PVar6;
  auVar143._17_3_ = 0;
  auVar143[0x14] = PVar6;
  auVar143._21_3_ = 0;
  auVar143[0x18] = PVar6;
  auVar143._25_3_ = 0;
  auVar143[0x1c] = PVar6;
  auVar143._29_3_ = 0;
  auVar150 = vpcmpgtd_avx2(auVar143,_DAT_01fe9900);
  auVar117 = vcmpps_avx(local_320,auVar12,2);
  auVar117 = vandps_avx(auVar117,auVar150);
  uVar92 = vmovmskps_avx(auVar117);
  if (uVar92 == 0) {
    return false;
  }
  uVar92 = uVar92 & 0xff;
  auVar117._16_16_ = mm_lookupmask_ps._240_16_;
  auVar117._0_16_ = mm_lookupmask_ps._240_16_;
  local_2c0 = vblendps_avx(auVar117,ZEXT832(0) << 0x20,0x80);
  local_660 = 0x80000000;
  uStack_65c = 0x80000000;
  uStack_658 = 0x80000000;
  uStack_654 = 0x80000000;
  fStack_650 = -0.0;
  fStack_64c = -0.0;
  fStack_648 = -0.0;
  uStack_644 = 0x80000000;
  local_8b0 = prim;
LAB_0182a7ab:
  lVar18 = 0;
  local_8a8 = (ulong)uVar92;
  for (uVar97 = local_8a8; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x8000000000000000) {
    lVar18 = lVar18 + 1;
  }
  uVar92 = *(uint *)(local_8b0 + 2);
  local_760 = *(uint *)(local_8b0 + lVar18 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar92].ptr;
  uVar97 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)local_760);
  p_Var8 = pGVar7[1].intersectionFilterN;
  lVar18 = *(long *)&pGVar7[1].time_range.upper;
  auVar9 = *(undefined1 (*) [16])(lVar18 + (long)p_Var8 * uVar97);
  auVar10 = *(undefined1 (*) [16])(lVar18 + (uVar97 + 1) * (long)p_Var8);
  auVar1 = *(undefined1 (*) [16])(lVar18 + (uVar97 + 2) * (long)p_Var8);
  local_8a8 = local_8a8 - 1 & local_8a8;
  auVar2 = *(undefined1 (*) [16])(lVar18 + (uVar97 + 3) * (long)p_Var8);
  if (local_8a8 != 0) {
    uVar98 = local_8a8 - 1 & local_8a8;
    for (uVar97 = local_8a8; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x8000000000000000) {
    }
    if (uVar98 != 0) {
      for (; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar3 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar4 = vinsertps_avx(auVar3,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar103 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar265._4_4_ = uVar103;
  auVar265._0_4_ = uVar103;
  auVar265._8_4_ = uVar103;
  auVar265._12_4_ = uVar103;
  fStack_7f0 = (float)uVar103;
  _local_800 = auVar265;
  fStack_7ec = (float)uVar103;
  fStack_7e8 = (float)uVar103;
  register0x0000149c = uVar103;
  auVar268 = ZEXT3264(_local_800);
  uVar103 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar271._4_4_ = uVar103;
  auVar271._0_4_ = uVar103;
  auVar271._8_4_ = uVar103;
  auVar271._12_4_ = uVar103;
  fStack_a70 = (float)uVar103;
  _local_a80 = auVar271;
  fStack_a6c = (float)uVar103;
  fStack_a68 = (float)uVar103;
  register0x000014dc = uVar103;
  auVar272 = ZEXT3264(_local_a80);
  auVar3 = vunpcklps_avx(auVar265,auVar271);
  fVar102 = *(float *)(ray + k * 4 + 0x60);
  auVar273._4_4_ = fVar102;
  auVar273._0_4_ = fVar102;
  auVar273._8_4_ = fVar102;
  auVar273._12_4_ = fVar102;
  fStack_970 = fVar102;
  _local_980 = auVar273;
  fStack_96c = fVar102;
  fStack_968 = fVar102;
  register0x0000151c = fVar102;
  auVar277 = ZEXT3264(_local_980);
  local_990 = vinsertps_avx(auVar3,auVar273,0x28);
  auVar225._0_4_ = (auVar9._0_4_ + auVar10._0_4_ + auVar1._0_4_ + auVar2._0_4_) * 0.25;
  auVar225._4_4_ = (auVar9._4_4_ + auVar10._4_4_ + auVar1._4_4_ + auVar2._4_4_) * 0.25;
  auVar225._8_4_ = (auVar9._8_4_ + auVar10._8_4_ + auVar1._8_4_ + auVar2._8_4_) * 0.25;
  auVar225._12_4_ = (auVar9._12_4_ + auVar10._12_4_ + auVar1._12_4_ + auVar2._12_4_) * 0.25;
  auVar3 = vsubps_avx(auVar225,auVar4);
  auVar3 = vdpps_avx(auVar3,local_990,0x7f);
  local_9a0 = vdpps_avx(local_990,local_990,0x7f);
  auVar258 = ZEXT1664(local_9a0);
  auVar5 = vrcpss_avx(local_9a0,local_9a0);
  auVar110 = vfnmadd213ss_fma(auVar5,local_9a0,ZEXT416(0x40000000));
  local_2e0 = auVar3._0_4_ * auVar5._0_4_ * auVar110._0_4_;
  auVar166._4_4_ = local_2e0;
  auVar166._0_4_ = local_2e0;
  auVar166._8_4_ = local_2e0;
  auVar166._12_4_ = local_2e0;
  fStack_910 = local_2e0;
  _local_920 = auVar166;
  fStack_90c = local_2e0;
  fStack_908 = local_2e0;
  fStack_904 = local_2e0;
  auVar3 = vfmadd231ps_fma(auVar4,local_990,auVar166);
  auVar3 = vblendps_avx(auVar3,_DAT_01f7aa10,8);
  auVar4 = vsubps_avx(auVar9,auVar3);
  auVar1 = vsubps_avx(auVar1,auVar3);
  auVar5 = vsubps_avx(auVar10,auVar3);
  auVar2 = vsubps_avx(auVar2,auVar3);
  auVar9 = vmovshdup_avx(auVar4);
  local_400 = auVar9._0_8_;
  auVar9 = vshufps_avx(auVar4,auVar4,0xaa);
  local_1e0 = auVar9._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar9 = vshufps_avx(auVar4,auVar4,0xff);
  local_420 = auVar9._0_8_;
  auVar9 = vmovshdup_avx(auVar5);
  local_200 = auVar9._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar9 = vshufps_avx(auVar5,auVar5,0xaa);
  local_220 = auVar9._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar9 = vshufps_avx(auVar5,auVar5,0xff);
  local_240 = auVar9._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar9 = vmovshdup_avx(auVar1);
  local_440 = auVar9._0_8_;
  auVar9 = vshufps_avx(auVar1,auVar1,0xaa);
  local_460 = auVar9._0_8_;
  auVar9 = vshufps_avx(auVar1,auVar1,0xff);
  local_480 = auVar9._0_8_;
  auVar9 = vmovshdup_avx(auVar2);
  local_4a0 = auVar9._0_8_;
  auVar9 = vshufps_avx(auVar2,auVar2,0xaa);
  local_4c0 = auVar9._0_8_;
  auVar9 = vshufps_avx(auVar2,auVar2,0xff);
  local_4e0 = auVar9._0_8_;
  auVar9 = vfmadd231ps_fma(ZEXT432((uint)(fVar102 * fVar102)),_local_a80,_local_a80);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),_local_800,_local_800);
  uVar103 = auVar9._0_4_;
  local_260._4_4_ = uVar103;
  local_260._0_4_ = uVar103;
  local_260._8_4_ = uVar103;
  local_260._12_4_ = uVar103;
  local_260._16_4_ = uVar103;
  local_260._20_4_ = uVar103;
  local_260._24_4_ = uVar103;
  local_260._28_4_ = uVar103;
  auVar241 = ZEXT3264(local_260);
  fVar102 = *(float *)(ray + k * 4 + 0x30);
  local_8d0 = ZEXT416((uint)local_2e0);
  local_2e0 = fVar102 - local_2e0;
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  local_be8 = 1;
  uVar97 = 0;
  bVar99 = false;
  local_500 = auVar4._0_4_;
  local_280 = auVar5._0_4_;
  uStack_27c = local_280;
  uStack_278 = local_280;
  uStack_274 = local_280;
  uStack_270 = local_280;
  uStack_26c = local_280;
  uStack_268 = local_280;
  uStack_264 = local_280;
  local_520 = auVar1._0_4_;
  fVar130 = auVar2._0_4_;
  local_560 = vandps_avx(local_260,local_860);
  auVar9 = vsqrtss_avx(local_9a0,local_9a0);
  auVar10 = vsqrtss_avx(local_9a0,local_9a0);
  local_570 = ZEXT816(0x3f80000000000000);
  uStack_75c = local_760;
  uStack_758 = local_760;
  uStack_754 = local_760;
  local_750 = uVar92;
  uStack_74c = uVar92;
  uStack_748 = uVar92;
  uStack_744 = uVar92;
  local_540 = fVar130;
  fStack_53c = fVar130;
  fStack_538 = fVar130;
  fStack_534 = fVar130;
  fStack_530 = fVar130;
  fStack_52c = fVar130;
  fStack_528 = fVar130;
  fStack_524 = fVar130;
  uStack_51c = local_520;
  uStack_518 = local_520;
  uStack_514 = local_520;
  uStack_510 = local_520;
  uStack_50c = local_520;
  uStack_508 = local_520;
  uStack_504 = local_520;
  uStack_4fc = local_500;
  uStack_4f8 = local_500;
  uStack_4f4 = local_500;
  uStack_4f0 = local_500;
  uStack_4ec = local_500;
  uStack_4e8 = local_500;
  uStack_4e4 = local_500;
  uStack_4d8 = local_4e0;
  uStack_4d0 = local_4e0;
  uStack_4c8 = local_4e0;
  uStack_4b8 = local_4c0;
  uStack_4b0 = local_4c0;
  uStack_4a8 = local_4c0;
  uStack_498 = local_4a0;
  uStack_490 = local_4a0;
  uStack_488 = local_4a0;
  uStack_478 = local_480;
  uStack_470 = local_480;
  uStack_468 = local_480;
  uStack_458 = local_460;
  uStack_450 = local_460;
  uStack_448 = local_460;
  uStack_438 = local_440;
  uStack_430 = local_440;
  uStack_428 = local_440;
  uStack_418 = local_420;
  uStack_410 = local_420;
  uStack_408 = local_420;
  uStack_3f8 = local_400;
  uStack_3f0 = local_400;
  uStack_3e8 = local_400;
  do {
    auVar196._8_4_ = 0x3f800000;
    auVar196._0_8_ = 0x3f8000003f800000;
    auVar196._12_4_ = 0x3f800000;
    auVar196._16_4_ = 0x3f800000;
    auVar196._20_4_ = 0x3f800000;
    auVar196._24_4_ = 0x3f800000;
    auVar196._28_4_ = 0x3f800000;
    iVar96 = (int)uVar97;
    auVar3 = vmovshdup_avx(local_570);
    auVar3 = vsubps_avx(auVar3,local_570);
    local_940._0_4_ = auVar3._0_4_;
    fVar223 = (float)local_940._0_4_ * 0.04761905;
    uVar103 = local_570._0_4_;
    local_a00._4_4_ = uVar103;
    local_a00._0_4_ = uVar103;
    local_a00._8_4_ = uVar103;
    local_a00._12_4_ = uVar103;
    local_a00._16_4_ = uVar103;
    local_a00._20_4_ = uVar103;
    local_a00._24_4_ = uVar103;
    local_a00._28_4_ = uVar103;
    local_940._4_4_ = local_940._0_4_;
    local_940._8_4_ = local_940._0_4_;
    local_940._12_4_ = local_940._0_4_;
    local_940._16_4_ = local_940._0_4_;
    local_940._20_4_ = local_940._0_4_;
    local_940._24_4_ = local_940._0_4_;
    local_940._28_4_ = local_940._0_4_;
    auVar3 = vfmadd231ps_fma(local_a00,local_940,_DAT_01faff20);
    auVar117 = vsubps_avx(auVar196,ZEXT1632(auVar3));
    fVar204 = auVar117._0_4_;
    fVar219 = auVar117._4_4_;
    fVar218 = auVar117._8_4_;
    fVar253 = auVar117._12_4_;
    fVar220 = auVar117._16_4_;
    fVar270 = auVar117._20_4_;
    fVar224 = auVar117._24_4_;
    fVar104 = fVar204 * fVar204 * fVar204;
    fVar131 = fVar219 * fVar219 * fVar219;
    fVar132 = fVar218 * fVar218 * fVar218;
    fVar133 = fVar253 * fVar253 * fVar253;
    fVar134 = fVar220 * fVar220 * fVar220;
    fVar135 = fVar270 * fVar270 * fVar270;
    fVar136 = fVar224 * fVar224 * fVar224;
    fVar216 = auVar3._0_4_;
    fVar222 = auVar3._4_4_;
    fVar217 = auVar3._8_4_;
    fVar221 = auVar3._12_4_;
    fVar155 = fVar216 * fVar216 * fVar216;
    fVar182 = fVar222 * fVar222 * fVar222;
    fVar183 = fVar217 * fVar217 * fVar217;
    fVar184 = fVar221 * fVar221 * fVar221;
    fVar254 = fVar204 * fVar216;
    fVar259 = fVar219 * fVar222;
    fVar260 = fVar218 * fVar217;
    fVar261 = fVar253 * fVar221;
    fVar262 = fVar220 * 0.0;
    fVar263 = fVar270 * 0.0;
    fVar264 = fVar224 * 0.0;
    fVar269 = auVar268._28_4_ + auVar277._28_4_;
    auVar150._4_4_ = fVar131 * 0.16666667;
    auVar150._0_4_ = fVar104 * 0.16666667;
    auVar150._8_4_ = fVar132 * 0.16666667;
    auVar150._12_4_ = fVar133 * 0.16666667;
    auVar150._16_4_ = fVar134 * 0.16666667;
    auVar150._20_4_ = fVar135 * 0.16666667;
    auVar150._24_4_ = fVar136 * 0.16666667;
    auVar150._28_4_ = fVar269 + (float)local_940._0_4_;
    auVar19._4_4_ =
         (fVar219 * fVar259 * 12.0 + fVar259 * fVar222 * 6.0 + fVar182 + fVar131 * 4.0) * 0.16666667
    ;
    auVar19._0_4_ =
         (fVar204 * fVar254 * 12.0 + fVar254 * fVar216 * 6.0 + fVar155 + fVar104 * 4.0) * 0.16666667
    ;
    auVar19._8_4_ =
         (fVar218 * fVar260 * 12.0 + fVar260 * fVar217 * 6.0 + fVar183 + fVar132 * 4.0) * 0.16666667
    ;
    auVar19._12_4_ =
         (fVar253 * fVar261 * 12.0 + fVar261 * fVar221 * 6.0 + fVar184 + fVar133 * 4.0) * 0.16666667
    ;
    auVar19._16_4_ =
         (fVar220 * fVar262 * 12.0 + fVar262 * 0.0 * 6.0 + fVar134 * 4.0 + 0.0) * 0.16666667;
    auVar19._20_4_ =
         (fVar270 * fVar263 * 12.0 + fVar263 * 0.0 * 6.0 + fVar135 * 4.0 + 0.0) * 0.16666667;
    auVar19._24_4_ =
         (fVar224 * fVar264 * 12.0 + fVar264 * 0.0 * 6.0 + fVar136 * 4.0 + 0.0) * 0.16666667;
    auVar19._28_4_ = auVar272._28_4_;
    auVar20._4_4_ =
         (fVar182 * 4.0 + fVar131 + fVar259 * fVar222 * 12.0 + fVar219 * fVar259 * 6.0) * 0.16666667
    ;
    auVar20._0_4_ =
         (fVar155 * 4.0 + fVar104 + fVar254 * fVar216 * 12.0 + fVar204 * fVar254 * 6.0) * 0.16666667
    ;
    auVar20._8_4_ =
         (fVar183 * 4.0 + fVar132 + fVar260 * fVar217 * 12.0 + fVar218 * fVar260 * 6.0) * 0.16666667
    ;
    auVar20._12_4_ =
         (fVar184 * 4.0 + fVar133 + fVar261 * fVar221 * 12.0 + fVar253 * fVar261 * 6.0) * 0.16666667
    ;
    auVar20._16_4_ = (fVar134 + 0.0 + fVar262 * 0.0 * 12.0 + fVar220 * fVar262 * 6.0) * 0.16666667;
    auVar20._20_4_ = (fVar135 + 0.0 + fVar263 * 0.0 * 12.0 + fVar270 * fVar263 * 6.0) * 0.16666667;
    auVar20._24_4_ = (fVar136 + 0.0 + fVar264 * 0.0 * 12.0 + fVar224 * fVar264 * 6.0) * 0.16666667;
    auVar20._28_4_ = auVar277._28_4_;
    fVar155 = fVar155 * 0.16666667;
    fVar182 = fVar182 * 0.16666667;
    fVar183 = fVar183 * 0.16666667;
    fVar184 = fVar184 * 0.16666667;
    auVar21._4_4_ = fVar182 * fStack_53c;
    auVar21._0_4_ = fVar155 * local_540;
    auVar21._8_4_ = fVar183 * fStack_538;
    auVar21._12_4_ = fVar184 * fStack_534;
    auVar21._16_4_ = fStack_530 * 0.0;
    auVar21._20_4_ = fStack_52c * 0.0;
    auVar21._24_4_ = fStack_528 * 0.0;
    auVar21._28_4_ = local_940._0_4_;
    auVar22._4_4_ = fVar182 * local_4a0._4_4_;
    auVar22._0_4_ = fVar155 * (float)local_4a0;
    auVar22._8_4_ = fVar183 * (float)uStack_498;
    auVar22._12_4_ = fVar184 * uStack_498._4_4_;
    auVar22._16_4_ = (float)uStack_490 * 0.0;
    auVar22._20_4_ = uStack_490._4_4_ * 0.0;
    auVar22._24_4_ = (float)uStack_488 * 0.0;
    auVar22._28_4_ = fVar269 + DAT_01faff20._28_4_ + 0.0;
    auVar23._4_4_ = fVar182 * local_4c0._4_4_;
    auVar23._0_4_ = fVar155 * (float)local_4c0;
    auVar23._8_4_ = fVar183 * (float)uStack_4b8;
    auVar23._12_4_ = fVar184 * uStack_4b8._4_4_;
    auVar23._16_4_ = (float)uStack_4b0 * 0.0;
    auVar23._20_4_ = uStack_4b0._4_4_ * 0.0;
    auVar23._24_4_ = (float)uStack_4a8 * 0.0;
    auVar23._28_4_ = 0;
    auVar24._4_4_ = fVar182 * local_4e0._4_4_;
    auVar24._0_4_ = fVar155 * (float)local_4e0;
    auVar24._8_4_ = fVar183 * (float)uStack_4d8;
    auVar24._12_4_ = fVar184 * uStack_4d8._4_4_;
    auVar24._16_4_ = (float)uStack_4d0 * 0.0;
    auVar24._20_4_ = uStack_4d0._4_4_ * 0.0;
    auVar24._24_4_ = (float)uStack_4c8 * 0.0;
    auVar24._28_4_ = 0x40c00000;
    auVar70._4_4_ = uStack_51c;
    auVar70._0_4_ = local_520;
    auVar70._8_4_ = uStack_518;
    auVar70._12_4_ = uStack_514;
    auVar70._16_4_ = uStack_510;
    auVar70._20_4_ = uStack_50c;
    auVar70._24_4_ = uStack_508;
    auVar70._28_4_ = uStack_504;
    auVar3 = vfmadd231ps_fma(auVar21,auVar20,auVar70);
    auVar78._8_8_ = uStack_438;
    auVar78._0_8_ = local_440;
    auVar78._16_8_ = uStack_430;
    auVar78._24_8_ = uStack_428;
    auVar110 = vfmadd231ps_fma(auVar22,auVar20,auVar78);
    auVar76._8_8_ = uStack_458;
    auVar76._0_8_ = local_460;
    auVar76._16_8_ = uStack_450;
    auVar76._24_8_ = uStack_448;
    auVar287 = vfmadd231ps_fma(auVar23,auVar20,auVar76);
    auVar74._8_8_ = uStack_478;
    auVar74._0_8_ = local_480;
    auVar74._16_8_ = uStack_470;
    auVar74._24_8_ = uStack_468;
    auVar112 = vfmadd231ps_fma(auVar24,auVar20,auVar74);
    auVar86._4_4_ = uStack_27c;
    auVar86._0_4_ = local_280;
    auVar86._8_4_ = uStack_278;
    auVar86._12_4_ = uStack_274;
    auVar86._16_4_ = uStack_270;
    auVar86._20_4_ = uStack_26c;
    auVar86._24_4_ = uStack_268;
    auVar86._28_4_ = uStack_264;
    auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar19,auVar86);
    auVar89._8_8_ = uStack_1f8;
    auVar89._0_8_ = local_200;
    auVar89._16_8_ = uStack_1f0;
    auVar89._24_8_ = uStack_1e8;
    auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar19,auVar89);
    auVar88._8_8_ = uStack_218;
    auVar88._0_8_ = local_220;
    auVar88._16_8_ = uStack_210;
    auVar88._24_8_ = uStack_208;
    auVar287 = vfmadd231ps_fma(ZEXT1632(auVar287),auVar19,auVar88);
    auVar87._8_8_ = uStack_238;
    auVar87._0_8_ = local_240;
    auVar87._16_8_ = uStack_230;
    auVar87._24_8_ = uStack_228;
    auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar87,auVar19);
    auVar72._4_4_ = uStack_4fc;
    auVar72._0_4_ = local_500;
    auVar72._8_4_ = uStack_4f8;
    auVar72._12_4_ = uStack_4f4;
    auVar72._16_4_ = uStack_4f0;
    auVar72._20_4_ = uStack_4ec;
    auVar72._24_4_ = uStack_4e8;
    auVar72._28_4_ = uStack_4e4;
    auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar150,auVar72);
    auVar118 = ZEXT1632(auVar3);
    auVar82._8_8_ = uStack_3f8;
    auVar82._0_8_ = local_400;
    auVar82._16_8_ = uStack_3f0;
    auVar82._24_8_ = uStack_3e8;
    auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar150,auVar82);
    local_960 = ZEXT1632(auVar110);
    auVar90._8_8_ = uStack_1d8;
    auVar90._0_8_ = local_1e0;
    auVar90._16_8_ = uStack_1d0;
    auVar90._24_8_ = uStack_1c8;
    auVar3 = vfmadd231ps_fma(ZEXT1632(auVar287),auVar150,auVar90);
    auVar80._8_8_ = uStack_418;
    auVar80._0_8_ = local_420;
    auVar80._16_8_ = uStack_410;
    auVar80._24_8_ = uStack_408;
    auVar287 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar150,auVar80);
    auVar233._0_4_ = (float)((uint)fVar216 ^ local_660) * fVar216;
    auVar233._4_4_ = (float)((uint)fVar222 ^ uStack_65c) * fVar222;
    auVar233._8_4_ = (float)((uint)fVar217 ^ uStack_658) * fVar217;
    auVar233._12_4_ = (float)((uint)fVar221 ^ uStack_654) * fVar221;
    auVar233._16_4_ = fStack_650 * 0.0;
    auVar233._20_4_ = fStack_64c * 0.0;
    auVar233._24_4_ = fStack_648 * 0.0;
    auVar233._28_4_ = 0;
    auVar25._4_4_ = fVar259 * 4.0;
    auVar25._0_4_ = fVar254 * 4.0;
    auVar25._8_4_ = fVar260 * 4.0;
    auVar25._12_4_ = fVar261 * 4.0;
    auVar25._16_4_ = fVar262 * 4.0;
    auVar25._20_4_ = fVar263 * 4.0;
    fVar104 = auVar258._28_4_;
    auVar25._24_4_ = fVar264 * 4.0;
    auVar25._28_4_ = fVar104;
    auVar150 = vsubps_avx(auVar233,auVar25);
    auVar26._4_4_ = fVar219 * (float)((uint)fVar219 ^ uStack_65c) * 0.5;
    auVar26._0_4_ = fVar204 * (float)((uint)fVar204 ^ local_660) * 0.5;
    auVar26._8_4_ = fVar218 * (float)((uint)fVar218 ^ uStack_658) * 0.5;
    auVar26._12_4_ = fVar253 * (float)((uint)fVar253 ^ uStack_654) * 0.5;
    auVar26._16_4_ = fVar220 * (float)((uint)fVar220 ^ (uint)fStack_650) * 0.5;
    auVar26._20_4_ = fVar270 * (float)((uint)fVar270 ^ (uint)fStack_64c) * 0.5;
    auVar26._24_4_ = fVar224 * (float)((uint)fVar224 ^ (uint)fStack_648) * 0.5;
    auVar26._28_4_ = auVar117._28_4_;
    auVar27._4_4_ = auVar150._4_4_ * 0.5;
    auVar27._0_4_ = auVar150._0_4_ * 0.5;
    auVar27._8_4_ = auVar150._8_4_ * 0.5;
    auVar27._12_4_ = auVar150._12_4_ * 0.5;
    auVar27._16_4_ = auVar150._16_4_ * 0.5;
    auVar27._20_4_ = auVar150._20_4_ * 0.5;
    auVar27._24_4_ = auVar150._24_4_ * 0.5;
    auVar27._28_4_ = auVar150._28_4_;
    auVar28._4_4_ = (fVar259 * 4.0 + fVar219 * fVar219) * 0.5;
    auVar28._0_4_ = (fVar254 * 4.0 + fVar204 * fVar204) * 0.5;
    auVar28._8_4_ = (fVar260 * 4.0 + fVar218 * fVar218) * 0.5;
    auVar28._12_4_ = (fVar261 * 4.0 + fVar253 * fVar253) * 0.5;
    auVar28._16_4_ = (fVar262 * 4.0 + fVar220 * fVar220) * 0.5;
    auVar28._20_4_ = (fVar263 * 4.0 + fVar270 * fVar270) * 0.5;
    auVar28._24_4_ = (fVar264 * 4.0 + fVar224 * fVar224) * 0.5;
    auVar28._28_4_ = fVar104 + auVar241._28_4_;
    fVar204 = fVar216 * fVar216 * 0.5;
    fVar216 = fVar222 * fVar222 * 0.5;
    fVar219 = fVar217 * fVar217 * 0.5;
    fVar222 = fVar221 * fVar221 * 0.5;
    auVar29._4_4_ = fVar216 * fStack_53c;
    auVar29._0_4_ = fVar204 * local_540;
    auVar29._8_4_ = fVar219 * fStack_538;
    auVar29._12_4_ = fVar222 * fStack_534;
    auVar29._16_4_ = fStack_530 * 0.0;
    auVar29._20_4_ = fStack_52c * 0.0;
    auVar29._24_4_ = fStack_528 * 0.0;
    auVar29._28_4_ = fVar104;
    auVar30._4_4_ = fVar216 * local_4a0._4_4_;
    auVar30._0_4_ = fVar204 * (float)local_4a0;
    auVar30._8_4_ = fVar219 * (float)uStack_498;
    auVar30._12_4_ = fVar222 * uStack_498._4_4_;
    auVar30._16_4_ = (float)uStack_490 * 0.0;
    auVar30._20_4_ = uStack_490._4_4_ * 0.0;
    auVar30._24_4_ = (float)uStack_488 * 0.0;
    auVar30._28_4_ = uStack_644;
    auVar31._4_4_ = fVar216 * local_4c0._4_4_;
    auVar31._0_4_ = fVar204 * (float)local_4c0;
    auVar31._8_4_ = fVar219 * (float)uStack_4b8;
    auVar31._12_4_ = fVar222 * uStack_4b8._4_4_;
    auVar31._16_4_ = (float)uStack_4b0 * 0.0;
    auVar31._20_4_ = uStack_4b0._4_4_ * 0.0;
    auVar31._24_4_ = (float)uStack_4a8 * 0.0;
    auVar31._28_4_ = auVar272._28_4_;
    auVar32._4_4_ = fVar216 * local_4e0._4_4_;
    auVar32._0_4_ = fVar204 * (float)local_4e0;
    auVar32._8_4_ = fVar219 * (float)uStack_4d8;
    auVar32._12_4_ = fVar222 * uStack_4d8._4_4_;
    auVar32._16_4_ = (float)uStack_4d0 * 0.0;
    auVar32._20_4_ = uStack_4d0._4_4_ * 0.0;
    auVar32._24_4_ = (float)uStack_4c8 * 0.0;
    auVar32._28_4_ = 0;
    auVar71._4_4_ = uStack_51c;
    auVar71._0_4_ = local_520;
    auVar71._8_4_ = uStack_518;
    auVar71._12_4_ = uStack_514;
    auVar71._16_4_ = uStack_510;
    auVar71._20_4_ = uStack_50c;
    auVar71._24_4_ = uStack_508;
    auVar71._28_4_ = uStack_504;
    auVar112 = vfmadd231ps_fma(auVar29,auVar28,auVar71);
    auVar79._8_8_ = uStack_438;
    auVar79._0_8_ = local_440;
    auVar79._16_8_ = uStack_430;
    auVar79._24_8_ = uStack_428;
    auVar106 = vfmadd231ps_fma(auVar30,auVar28,auVar79);
    auVar77._8_8_ = uStack_458;
    auVar77._0_8_ = local_460;
    auVar77._16_8_ = uStack_450;
    auVar77._24_8_ = uStack_448;
    auVar225 = vfmadd231ps_fma(auVar31,auVar28,auVar77);
    auVar75._8_8_ = uStack_478;
    auVar75._0_8_ = local_480;
    auVar75._16_8_ = uStack_470;
    auVar75._24_8_ = uStack_468;
    auVar166 = vfmadd231ps_fma(auVar32,auVar28,auVar75);
    auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar27,auVar86);
    auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar27,auVar89);
    auVar225 = vfmadd231ps_fma(ZEXT1632(auVar225),auVar27,auVar88);
    auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar87,auVar27);
    auVar73._4_4_ = uStack_4fc;
    auVar73._0_4_ = local_500;
    auVar73._8_4_ = uStack_4f8;
    auVar73._12_4_ = uStack_4f4;
    auVar73._16_4_ = uStack_4f0;
    auVar73._20_4_ = uStack_4ec;
    auVar73._24_4_ = uStack_4e8;
    auVar73._28_4_ = uStack_4e4;
    auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar26,auVar73);
    auVar83._8_8_ = uStack_3f8;
    auVar83._0_8_ = local_400;
    auVar83._16_8_ = uStack_3f0;
    auVar83._24_8_ = uStack_3e8;
    auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar26,auVar83);
    auVar225 = vfmadd231ps_fma(ZEXT1632(auVar225),auVar26,auVar90);
    auVar81._8_8_ = uStack_418;
    auVar81._0_8_ = local_420;
    auVar81._16_8_ = uStack_410;
    auVar81._24_8_ = uStack_408;
    auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar26,auVar81);
    auVar257._0_4_ = auVar112._0_4_ * fVar223;
    auVar257._4_4_ = auVar112._4_4_ * fVar223;
    auVar257._8_4_ = auVar112._8_4_ * fVar223;
    auVar257._12_4_ = auVar112._12_4_ * fVar223;
    auVar257._16_4_ = fVar223 * 0.0;
    auVar257._20_4_ = fVar223 * 0.0;
    auVar257._24_4_ = fVar223 * 0.0;
    auVar257._28_4_ = 0;
    fVar204 = auVar106._0_4_ * fVar223;
    fVar216 = auVar106._4_4_ * fVar223;
    local_a20._4_4_ = fVar216;
    local_a20._0_4_ = fVar204;
    fVar219 = auVar106._8_4_ * fVar223;
    local_a20._8_4_ = fVar219;
    fVar222 = auVar106._12_4_ * fVar223;
    local_a20._12_4_ = fVar222;
    local_a20._16_4_ = fVar223 * 0.0;
    local_a20._20_4_ = fVar223 * 0.0;
    local_a20._24_4_ = fVar223 * 0.0;
    local_a20._28_4_ = (int)((ulong)uStack_1c8 >> 0x20);
    fVar136 = auVar225._0_4_ * fVar223;
    fVar155 = auVar225._4_4_ * fVar223;
    local_9c0._4_4_ = fVar155;
    local_9c0._0_4_ = fVar136;
    fVar182 = auVar225._8_4_ * fVar223;
    local_9c0._8_4_ = fVar182;
    fVar183 = auVar225._12_4_ * fVar223;
    local_9c0._12_4_ = fVar183;
    fVar184 = fVar223 * 0.0;
    local_9c0._16_4_ = fVar184;
    fVar254 = fVar223 * 0.0;
    local_9c0._20_4_ = fVar254;
    uVar103 = (undefined4)((ulong)uStack_1e8 >> 0x20);
    fVar259 = fVar223 * 0.0;
    local_9c0._24_4_ = fVar259;
    local_9c0._28_4_ = uVar103;
    auVar213._0_4_ = fVar223 * auVar166._0_4_;
    auVar213._4_4_ = fVar223 * auVar166._4_4_;
    auVar213._8_4_ = fVar223 * auVar166._8_4_;
    auVar213._12_4_ = fVar223 * auVar166._12_4_;
    auVar213._16_4_ = fVar223 * 0.0;
    auVar213._20_4_ = fVar223 * 0.0;
    auVar213._24_4_ = fVar223 * 0.0;
    auVar213._28_4_ = 0;
    auVar143 = vpermps_avx2(_DAT_01fec480,auVar118);
    auVar171 = vpermps_avx2(_DAT_01fec480,local_960);
    auVar172 = ZEXT1632(auVar3);
    local_780 = vpermps_avx2(_DAT_01fec480,auVar172);
    auVar15 = vsubps_avx(auVar143,auVar118);
    auVar122 = vsubps_avx(local_780,ZEXT1632(auVar3));
    fVar221 = auVar122._0_4_;
    fVar220 = auVar122._4_4_;
    auVar33._4_4_ = fVar220 * auVar257._4_4_;
    auVar33._0_4_ = fVar221 * auVar257._0_4_;
    fVar224 = auVar122._8_4_;
    auVar33._8_4_ = fVar224 * auVar257._8_4_;
    fVar104 = auVar122._12_4_;
    auVar33._12_4_ = fVar104 * auVar257._12_4_;
    fVar131 = auVar122._16_4_;
    auVar33._16_4_ = fVar131 * auVar257._16_4_;
    fVar132 = auVar122._20_4_;
    auVar33._20_4_ = fVar132 * auVar257._20_4_;
    fVar133 = auVar122._24_4_;
    auVar33._24_4_ = fVar133 * auVar257._24_4_;
    auVar33._28_4_ = auVar143._28_4_;
    auVar3 = vfmsub231ps_fma(auVar33,local_9c0,auVar15);
    auVar147 = vsubps_avx(auVar171,local_960);
    fVar263 = auVar15._0_4_;
    fVar264 = auVar15._4_4_;
    auVar34._4_4_ = fVar264 * fVar216;
    auVar34._0_4_ = fVar263 * fVar204;
    fVar269 = auVar15._8_4_;
    auVar34._8_4_ = fVar269 * fVar219;
    fVar283 = auVar15._12_4_;
    auVar34._12_4_ = fVar283 * fVar222;
    fVar284 = auVar15._16_4_;
    auVar34._16_4_ = fVar284 * fVar223 * 0.0;
    fVar285 = auVar15._20_4_;
    auVar34._20_4_ = fVar285 * fVar223 * 0.0;
    fVar286 = auVar15._24_4_;
    auVar34._24_4_ = fVar286 * fVar223 * 0.0;
    auVar34._28_4_ = auVar171._28_4_;
    auVar112 = vfmsub231ps_fma(auVar34,auVar257,auVar147);
    auVar3 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar112._12_4_ * auVar112._12_4_,
                                                CONCAT48(auVar112._8_4_ * auVar112._8_4_,
                                                         CONCAT44(auVar112._4_4_ * auVar112._4_4_,
                                                                  auVar112._0_4_ * auVar112._0_4_)))
                                     ),ZEXT1632(auVar3),ZEXT1632(auVar3));
    fVar270 = auVar147._0_4_;
    fVar223 = auVar147._4_4_;
    auVar35._4_4_ = fVar223 * fVar155;
    auVar35._0_4_ = fVar270 * fVar136;
    fVar134 = auVar147._8_4_;
    auVar35._8_4_ = fVar134 * fVar182;
    fVar135 = auVar147._12_4_;
    auVar35._12_4_ = fVar135 * fVar183;
    fVar260 = auVar147._16_4_;
    auVar35._16_4_ = fVar260 * fVar184;
    fVar261 = auVar147._20_4_;
    auVar35._20_4_ = fVar261 * fVar254;
    fVar262 = auVar147._24_4_;
    auVar35._24_4_ = fVar262 * fVar259;
    auVar35._28_4_ = local_780._28_4_;
    auVar106 = vfmsub231ps_fma(auVar35,local_a20,auVar122);
    auVar197._0_4_ = fVar221 * fVar221;
    auVar197._4_4_ = fVar220 * fVar220;
    auVar197._8_4_ = fVar224 * fVar224;
    auVar197._12_4_ = fVar104 * fVar104;
    auVar197._16_4_ = fVar131 * fVar131;
    auVar197._20_4_ = fVar132 * fVar132;
    auVar197._24_4_ = fVar133 * fVar133;
    auVar197._28_4_ = 0;
    auVar112 = vfmadd231ps_fma(auVar197,auVar147,auVar147);
    auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar15,auVar15);
    auVar117 = vrcpps_avx(ZEXT1632(auVar112));
    auVar106 = vfmadd231ps_fma(ZEXT1632(auVar3),ZEXT1632(auVar106),ZEXT1632(auVar106));
    auVar119._8_4_ = 0x3f800000;
    auVar119._0_8_ = 0x3f8000003f800000;
    auVar119._12_4_ = 0x3f800000;
    auVar119._16_4_ = 0x3f800000;
    auVar119._20_4_ = 0x3f800000;
    auVar119._24_4_ = 0x3f800000;
    auVar119._28_4_ = 0x3f800000;
    auVar3 = vfnmadd213ps_fma(auVar117,ZEXT1632(auVar112),auVar119);
    auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar117,auVar117);
    _local_a40 = vpermps_avx2(_DAT_01fec480,auVar257);
    local_9e0 = vpermps_avx2(_DAT_01fec480,local_9c0);
    auVar36._4_4_ = fVar220 * local_a40._4_4_;
    auVar36._0_4_ = fVar221 * local_a40._0_4_;
    auVar36._8_4_ = fVar224 * local_a40._8_4_;
    auVar36._12_4_ = fVar104 * local_a40._12_4_;
    auVar36._16_4_ = fVar131 * local_a40._16_4_;
    auVar36._20_4_ = fVar132 * local_a40._20_4_;
    auVar36._24_4_ = fVar133 * local_a40._24_4_;
    auVar36._28_4_ = auVar117._28_4_;
    auVar225 = vfmsub231ps_fma(auVar36,local_9e0,auVar15);
    auVar230 = vpermps_avx2(_DAT_01fec480,local_a20);
    auVar37._4_4_ = fVar264 * auVar230._4_4_;
    auVar37._0_4_ = fVar263 * auVar230._0_4_;
    auVar37._8_4_ = fVar269 * auVar230._8_4_;
    auVar37._12_4_ = fVar283 * auVar230._12_4_;
    auVar37._16_4_ = fVar284 * auVar230._16_4_;
    auVar37._20_4_ = fVar285 * auVar230._20_4_;
    auVar37._24_4_ = fVar286 * auVar230._24_4_;
    auVar37._28_4_ = 0;
    auVar166 = vfmsub231ps_fma(auVar37,_local_a40,auVar147);
    auVar225 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar166._12_4_ * auVar166._12_4_,
                                                  CONCAT48(auVar166._8_4_ * auVar166._8_4_,
                                                           CONCAT44(auVar166._4_4_ * auVar166._4_4_,
                                                                    auVar166._0_4_ * auVar166._0_4_)
                                                          ))),ZEXT1632(auVar225),ZEXT1632(auVar225))
    ;
    auVar242._0_4_ = fVar270 * local_9e0._0_4_;
    auVar242._4_4_ = fVar223 * local_9e0._4_4_;
    auVar242._8_4_ = fVar134 * local_9e0._8_4_;
    auVar242._12_4_ = fVar135 * local_9e0._12_4_;
    auVar242._16_4_ = fVar260 * local_9e0._16_4_;
    auVar242._20_4_ = fVar261 * local_9e0._20_4_;
    auVar242._24_4_ = fVar262 * local_9e0._24_4_;
    auVar242._28_4_ = 0;
    auVar166 = vfmsub231ps_fma(auVar242,auVar230,auVar122);
    auVar225 = vfmadd231ps_fma(ZEXT1632(auVar225),ZEXT1632(auVar166),ZEXT1632(auVar166));
    auVar117 = vmaxps_avx(ZEXT1632(CONCAT412(auVar106._12_4_ * auVar3._12_4_,
                                             CONCAT48(auVar106._8_4_ * auVar3._8_4_,
                                                      CONCAT44(auVar106._4_4_ * auVar3._4_4_,
                                                               auVar106._0_4_ * auVar3._0_4_)))),
                          ZEXT1632(CONCAT412(auVar225._12_4_ * auVar3._12_4_,
                                             CONCAT48(auVar225._8_4_ * auVar3._8_4_,
                                                      CONCAT44(auVar225._4_4_ * auVar3._4_4_,
                                                               auVar225._0_4_ * auVar3._0_4_)))));
    local_7c0._0_4_ = auVar287._0_4_ + auVar213._0_4_;
    local_7c0._4_4_ = auVar287._4_4_ + auVar213._4_4_;
    local_7c0._8_4_ = auVar287._8_4_ + auVar213._8_4_;
    local_7c0._12_4_ = auVar287._12_4_ + auVar213._12_4_;
    local_7c0._16_4_ = auVar213._16_4_ + 0.0;
    local_7c0._20_4_ = auVar213._20_4_ + 0.0;
    local_7c0._24_4_ = auVar213._24_4_ + 0.0;
    local_7c0._28_4_ = 0;
    local_7a0 = ZEXT1632(auVar287);
    auVar150 = vsubps_avx(local_7a0,auVar213);
    local_7e0 = vpermps_avx2(_DAT_01fec480,auVar150);
    auVar237 = vpermps_avx2(_DAT_01fec480,local_7a0);
    auVar150 = vmaxps_avx(local_7a0,local_7c0);
    auVar13 = vmaxps_avx(local_7e0,auVar237);
    auVar14 = vrsqrtps_avx(ZEXT1632(auVar112));
    auVar150 = vmaxps_avx(auVar150,auVar13);
    fVar204 = auVar14._0_4_;
    fVar216 = auVar14._4_4_;
    fVar219 = auVar14._8_4_;
    fVar222 = auVar14._12_4_;
    fVar218 = auVar14._16_4_;
    fVar217 = auVar14._20_4_;
    fVar253 = auVar14._24_4_;
    auVar38._4_4_ = fVar216 * fVar216 * fVar216 * auVar112._4_4_ * -0.5;
    auVar38._0_4_ = fVar204 * fVar204 * fVar204 * auVar112._0_4_ * -0.5;
    auVar38._8_4_ = fVar219 * fVar219 * fVar219 * auVar112._8_4_ * -0.5;
    auVar38._12_4_ = fVar222 * fVar222 * fVar222 * auVar112._12_4_ * -0.5;
    auVar38._16_4_ = fVar218 * fVar218 * fVar218 * -0.0;
    auVar38._20_4_ = fVar217 * fVar217 * fVar217 * -0.0;
    auVar38._24_4_ = fVar253 * fVar253 * fVar253 * -0.0;
    auVar38._28_4_ = local_7e0._28_4_;
    auVar144._8_4_ = 0x3fc00000;
    auVar144._0_8_ = 0x3fc000003fc00000;
    auVar144._12_4_ = 0x3fc00000;
    auVar144._16_4_ = 0x3fc00000;
    auVar144._20_4_ = 0x3fc00000;
    auVar144._24_4_ = 0x3fc00000;
    auVar144._28_4_ = 0x3fc00000;
    auVar3 = vfmadd231ps_fma(auVar38,auVar144,auVar14);
    fVar216 = auVar3._0_4_;
    fVar222 = auVar3._4_4_;
    auVar39._4_4_ = fVar223 * fVar222;
    auVar39._0_4_ = fVar270 * fVar216;
    fVar253 = auVar3._8_4_;
    auVar39._8_4_ = fVar134 * fVar253;
    fVar270 = auVar3._12_4_;
    auVar39._12_4_ = fVar135 * fVar270;
    auVar39._16_4_ = fVar260 * 0.0;
    auVar39._20_4_ = fVar261 * 0.0;
    auVar39._24_4_ = fVar262 * 0.0;
    auVar39._28_4_ = 0;
    auVar40._4_4_ = (float)local_980._4_4_ * fVar220 * fVar222;
    auVar40._0_4_ = (float)local_980._0_4_ * fVar221 * fVar216;
    auVar40._8_4_ = fStack_978 * fVar224 * fVar253;
    auVar40._12_4_ = fStack_974 * fVar104 * fVar270;
    auVar40._16_4_ = fStack_970 * fVar131 * 0.0;
    auVar40._20_4_ = fStack_96c * fVar132 * 0.0;
    auVar40._24_4_ = fStack_968 * fVar133 * 0.0;
    auVar40._28_4_ = auVar147._28_4_;
    auVar287 = vfmadd231ps_fma(auVar40,auVar39,_local_a80);
    auVar13 = vsubps_avx(ZEXT832(0) << 0x20,auVar172);
    fVar219 = auVar13._0_4_;
    auVar290._0_4_ = fVar221 * fVar216 * fVar219;
    fVar218 = auVar13._4_4_;
    auVar290._4_4_ = fVar220 * fVar222 * fVar218;
    fVar221 = auVar13._8_4_;
    auVar290._8_4_ = fVar224 * fVar253 * fVar221;
    fVar224 = auVar13._12_4_;
    auVar290._12_4_ = fVar104 * fVar270 * fVar224;
    fVar104 = auVar13._16_4_;
    auVar290._16_4_ = fVar131 * 0.0 * fVar104;
    fVar131 = auVar13._20_4_;
    auVar290._20_4_ = fVar132 * 0.0 * fVar131;
    fVar132 = auVar13._24_4_;
    auVar290._24_4_ = fVar133 * 0.0 * fVar132;
    auVar290._28_4_ = 0;
    auVar249 = vsubps_avx(ZEXT832(0) << 0x20,local_960);
    auVar268 = ZEXT3264(auVar249);
    auVar112 = vfmadd231ps_fma(auVar290,auVar249,auVar39);
    auVar41._4_4_ = fVar264 * fVar222;
    auVar41._0_4_ = fVar263 * fVar216;
    auVar41._8_4_ = fVar269 * fVar253;
    auVar41._12_4_ = fVar283 * fVar270;
    auVar41._16_4_ = fVar284 * 0.0;
    auVar41._20_4_ = fVar285 * 0.0;
    auVar41._24_4_ = fVar286 * 0.0;
    auVar41._28_4_ = 0;
    auVar287 = vfmadd231ps_fma(ZEXT1632(auVar287),auVar41,_local_800);
    auVar272 = ZEXT1664(auVar287);
    auVar16 = vsubps_avx(ZEXT832(0) << 0x20,auVar118);
    auVar277 = ZEXT3264(auVar16);
    auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar16,auVar41);
    auVar42._4_4_ = (float)local_980._4_4_ * fVar218;
    auVar42._0_4_ = (float)local_980._0_4_ * fVar219;
    auVar42._8_4_ = fStack_978 * fVar221;
    auVar42._12_4_ = fStack_974 * fVar224;
    auVar42._16_4_ = fStack_970 * fVar104;
    auVar42._20_4_ = fStack_96c * fVar131;
    auVar42._24_4_ = fStack_968 * fVar132;
    auVar42._28_4_ = 0;
    auVar106 = vfmadd231ps_fma(auVar42,_local_a80,auVar249);
    auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),_local_800,auVar16);
    fVar204 = auVar112._0_4_;
    fVar260 = auVar287._0_4_;
    fVar217 = auVar112._4_4_;
    fVar261 = auVar287._4_4_;
    fVar220 = auVar112._8_4_;
    fVar262 = auVar287._8_4_;
    fVar223 = auVar112._12_4_;
    fVar263 = auVar287._12_4_;
    auVar43._28_4_ = auVar14._28_4_;
    auVar43._0_28_ =
         ZEXT1628(CONCAT412(fVar263 * fVar223,
                            CONCAT48(fVar262 * fVar220,CONCAT44(fVar261 * fVar217,fVar260 * fVar204)
                                    )));
    auVar11 = vsubps_avx(ZEXT1632(auVar106),auVar43);
    auVar44._4_4_ = fVar218 * fVar218;
    auVar44._0_4_ = fVar219 * fVar219;
    auVar44._8_4_ = fVar221 * fVar221;
    auVar44._12_4_ = fVar224 * fVar224;
    auVar44._16_4_ = fVar104 * fVar104;
    auVar44._20_4_ = fVar131 * fVar131;
    auVar44._24_4_ = fVar132 * fVar132;
    auVar44._28_4_ = auVar14._28_4_;
    auVar106 = vfmadd231ps_fma(auVar44,auVar249,auVar249);
    auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar16,auVar16);
    auVar45._28_4_ = auVar15._28_4_;
    auVar45._0_28_ =
         ZEXT1628(CONCAT412(fVar223 * fVar223,
                            CONCAT48(fVar220 * fVar220,CONCAT44(fVar217 * fVar217,fVar204 * fVar204)
                                    )));
    auVar14 = vsubps_avx(ZEXT1632(auVar106),auVar45);
    auVar13 = vsqrtps_avx(auVar117);
    fVar204 = (auVar13._0_4_ + auVar150._0_4_) * 1.0000002;
    fVar217 = (auVar13._4_4_ + auVar150._4_4_) * 1.0000002;
    fVar220 = (auVar13._8_4_ + auVar150._8_4_) * 1.0000002;
    fVar223 = (auVar13._12_4_ + auVar150._12_4_) * 1.0000002;
    fVar133 = (auVar13._16_4_ + auVar150._16_4_) * 1.0000002;
    fVar134 = (auVar13._20_4_ + auVar150._20_4_) * 1.0000002;
    fVar135 = (auVar13._24_4_ + auVar150._24_4_) * 1.0000002;
    auVar46._4_4_ = fVar217 * fVar217;
    auVar46._0_4_ = fVar204 * fVar204;
    auVar46._8_4_ = fVar220 * fVar220;
    auVar46._12_4_ = fVar223 * fVar223;
    auVar46._16_4_ = fVar133 * fVar133;
    auVar46._20_4_ = fVar134 * fVar134;
    auVar46._24_4_ = fVar135 * fVar135;
    auVar46._28_4_ = auVar13._28_4_ + auVar150._28_4_;
    local_2a0._0_4_ = auVar11._0_4_ + auVar11._0_4_;
    local_2a0._4_4_ = auVar11._4_4_ + auVar11._4_4_;
    local_2a0._8_4_ = auVar11._8_4_ + auVar11._8_4_;
    local_2a0._12_4_ = auVar11._12_4_ + auVar11._12_4_;
    local_2a0._16_4_ = auVar11._16_4_ + auVar11._16_4_;
    local_2a0._20_4_ = auVar11._20_4_ + auVar11._20_4_;
    local_2a0._24_4_ = auVar11._24_4_ + auVar11._24_4_;
    local_2a0._28_4_ = auVar11._28_4_ + auVar11._28_4_;
    auVar150 = vsubps_avx(auVar14,auVar46);
    auVar256 = ZEXT1632(auVar287);
    auVar47._28_4_ = 0x3f800002;
    auVar47._0_28_ =
         ZEXT1628(CONCAT412(fVar263 * fVar263,
                            CONCAT48(fVar262 * fVar262,CONCAT44(fVar261 * fVar261,fVar260 * fVar260)
                                    )));
    auVar11 = vsubps_avx(local_260,auVar47);
    auVar243._0_4_ = local_2a0._0_4_ * local_2a0._0_4_;
    auVar243._4_4_ = local_2a0._4_4_ * local_2a0._4_4_;
    auVar243._8_4_ = local_2a0._8_4_ * local_2a0._8_4_;
    auVar243._12_4_ = local_2a0._12_4_ * local_2a0._12_4_;
    auVar243._16_4_ = local_2a0._16_4_ * local_2a0._16_4_;
    auVar243._20_4_ = local_2a0._20_4_ * local_2a0._20_4_;
    auVar243._24_4_ = local_2a0._24_4_ * local_2a0._24_4_;
    auVar243._28_4_ = 0;
    fVar217 = auVar11._0_4_;
    fVar220 = auVar11._4_4_;
    fVar223 = auVar11._8_4_;
    fVar133 = auVar11._12_4_;
    fVar134 = auVar11._16_4_;
    fVar135 = auVar11._20_4_;
    fVar260 = auVar11._24_4_;
    auVar48._4_4_ = fVar220 * 4.0 * auVar150._4_4_;
    auVar48._0_4_ = fVar217 * 4.0 * auVar150._0_4_;
    auVar48._8_4_ = fVar223 * 4.0 * auVar150._8_4_;
    auVar48._12_4_ = fVar133 * 4.0 * auVar150._12_4_;
    auVar48._16_4_ = fVar134 * 4.0 * auVar150._16_4_;
    auVar48._20_4_ = fVar135 * 4.0 * auVar150._20_4_;
    auVar48._24_4_ = fVar260 * 4.0 * auVar150._24_4_;
    auVar48._28_4_ = 0x40800000;
    auVar12 = vsubps_avx(auVar243,auVar48);
    auVar117 = vcmpps_avx(auVar12,ZEXT432(0) << 0x20,5);
    auVar282 = ZEXT1632(auVar112);
    fVar204 = auVar11._28_4_;
    if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar117 >> 0x7f,0) == '\0') &&
          (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar117 >> 0xbf,0) == '\0') &&
        (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar117[0x1f])
    {
      auVar258 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar198._8_4_ = 0xff800000;
      auVar198._0_8_ = 0xff800000ff800000;
      auVar198._12_4_ = 0xff800000;
      auVar198._16_4_ = 0xff800000;
      auVar198._20_4_ = 0xff800000;
      auVar198._24_4_ = 0xff800000;
      auVar198._28_4_ = 0xff800000;
    }
    else {
      auVar289 = vsqrtps_avx(auVar12);
      auVar278._0_4_ = fVar217 + fVar217;
      auVar278._4_4_ = fVar220 + fVar220;
      auVar278._8_4_ = fVar223 + fVar223;
      auVar278._12_4_ = fVar133 + fVar133;
      auVar278._16_4_ = fVar134 + fVar134;
      auVar278._20_4_ = fVar135 + fVar135;
      auVar278._24_4_ = fVar260 + fVar260;
      auVar278._28_4_ = fVar204 + fVar204;
      auVar288 = vrcpps_avx(auVar278);
      auVar238 = vcmpps_avx(auVar12,ZEXT432(0) << 0x20,5);
      auVar199._8_4_ = 0x3f800000;
      auVar199._0_8_ = 0x3f8000003f800000;
      auVar199._12_4_ = 0x3f800000;
      auVar199._16_4_ = 0x3f800000;
      auVar199._20_4_ = 0x3f800000;
      auVar199._24_4_ = 0x3f800000;
      auVar199._28_4_ = 0x3f800000;
      auVar287 = vfnmadd213ps_fma(auVar278,auVar288,auVar199);
      auVar287 = vfmadd132ps_fma(ZEXT1632(auVar287),auVar288,auVar288);
      auVar200._0_4_ = (uint)local_2a0._0_4_ ^ local_660;
      auVar200._4_4_ = (uint)local_2a0._4_4_ ^ uStack_65c;
      auVar200._8_4_ = (uint)local_2a0._8_4_ ^ uStack_658;
      auVar200._12_4_ = (uint)local_2a0._12_4_ ^ uStack_654;
      auVar200._16_4_ = (uint)local_2a0._16_4_ ^ (uint)fStack_650;
      auVar200._20_4_ = (uint)local_2a0._20_4_ ^ (uint)fStack_64c;
      auVar200._24_4_ = (uint)local_2a0._24_4_ ^ (uint)fStack_648;
      auVar200._28_4_ = (uint)local_2a0._28_4_ ^ uStack_644;
      auVar12 = vsubps_avx(auVar200,auVar289);
      auVar49._4_4_ = auVar287._4_4_ * auVar12._4_4_;
      auVar49._0_4_ = auVar287._0_4_ * auVar12._0_4_;
      auVar49._8_4_ = auVar287._8_4_ * auVar12._8_4_;
      auVar49._12_4_ = auVar287._12_4_ * auVar12._12_4_;
      auVar49._16_4_ = auVar12._16_4_ * 0.0;
      auVar49._20_4_ = auVar12._20_4_ * 0.0;
      auVar49._24_4_ = auVar12._24_4_ * 0.0;
      auVar49._28_4_ = auVar12._28_4_;
      auVar12 = vsubps_avx(auVar289,local_2a0);
      auVar50._4_4_ = auVar287._4_4_ * auVar12._4_4_;
      auVar50._0_4_ = auVar287._0_4_ * auVar12._0_4_;
      auVar50._8_4_ = auVar287._8_4_ * auVar12._8_4_;
      auVar50._12_4_ = auVar287._12_4_ * auVar12._12_4_;
      auVar50._16_4_ = auVar12._16_4_ * 0.0;
      auVar50._20_4_ = auVar12._20_4_ * 0.0;
      auVar50._24_4_ = auVar12._24_4_ * 0.0;
      auVar50._28_4_ = auVar12._28_4_;
      auVar287 = vfmadd213ps_fma(auVar256,auVar49,auVar282);
      local_340 = ZEXT1632(CONCAT412(auVar287._12_4_ * fVar270,
                                     CONCAT48(auVar287._8_4_ * fVar253,
                                              CONCAT44(auVar287._4_4_ * fVar222,
                                                       auVar287._0_4_ * fVar216))));
      auVar12 = vandps_avx(local_860,auVar47);
      auVar12 = vmaxps_avx(local_560,auVar12);
      auVar51._4_4_ = auVar12._4_4_ * 1.9073486e-06;
      auVar51._0_4_ = auVar12._0_4_ * 1.9073486e-06;
      auVar51._8_4_ = auVar12._8_4_ * 1.9073486e-06;
      auVar51._12_4_ = auVar12._12_4_ * 1.9073486e-06;
      auVar51._16_4_ = auVar12._16_4_ * 1.9073486e-06;
      auVar51._20_4_ = auVar12._20_4_ * 1.9073486e-06;
      auVar51._24_4_ = auVar12._24_4_ * 1.9073486e-06;
      auVar51._28_4_ = auVar12._28_4_;
      auVar12 = vandps_avx(local_860,auVar11);
      auVar288 = vcmpps_avx(auVar12,auVar51,1);
      auVar287 = vfmadd213ps_fma(auVar256,auVar50,auVar282);
      auVar145._8_4_ = 0x7f800000;
      auVar145._0_8_ = 0x7f8000007f800000;
      auVar145._12_4_ = 0x7f800000;
      auVar145._16_4_ = 0x7f800000;
      auVar145._20_4_ = 0x7f800000;
      auVar145._24_4_ = 0x7f800000;
      auVar145._28_4_ = 0x7f800000;
      auVar12 = vblendvps_avx(auVar145,auVar49,auVar238);
      auVar258 = ZEXT3264(auVar12);
      local_360 = auVar287._0_4_ * fVar216;
      fStack_35c = auVar287._4_4_ * fVar222;
      fStack_358 = auVar287._8_4_ * fVar253;
      fStack_354 = auVar287._12_4_ * fVar270;
      uStack_350 = 0;
      uStack_34c = 0;
      uStack_348 = 0;
      uStack_344 = 0x7f800000;
      auVar146._8_4_ = 0xff800000;
      auVar146._0_8_ = 0xff800000ff800000;
      auVar146._12_4_ = 0xff800000;
      auVar146._16_4_ = 0xff800000;
      auVar146._20_4_ = 0xff800000;
      auVar146._24_4_ = 0xff800000;
      auVar146._28_4_ = 0xff800000;
      auVar198 = vblendvps_avx(auVar146,auVar50,auVar238);
      auVar289 = auVar238 & auVar288;
      if ((((((((auVar289 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar289 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar289 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar289 >> 0x7f,0) != '\0') ||
            (auVar289 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar289 >> 0xbf,0) != '\0') ||
          (auVar289 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar289[0x1f] < '\0') {
        auVar117 = vandps_avx(auVar288,auVar238);
        auVar288 = vcmpps_avx(auVar150,ZEXT832(0) << 0x20,2);
        auVar153._8_4_ = 0xff800000;
        auVar153._0_8_ = 0xff800000ff800000;
        auVar153._12_4_ = 0xff800000;
        auVar153._16_4_ = 0xff800000;
        auVar153._20_4_ = 0xff800000;
        auVar153._24_4_ = 0xff800000;
        auVar153._28_4_ = 0xff800000;
        auVar231._8_4_ = 0x7f800000;
        auVar231._0_8_ = 0x7f8000007f800000;
        auVar231._12_4_ = 0x7f800000;
        auVar231._16_4_ = 0x7f800000;
        auVar231._20_4_ = 0x7f800000;
        auVar231._24_4_ = 0x7f800000;
        auVar231._28_4_ = 0x7f800000;
        auVar150 = vblendvps_avx(auVar231,auVar153,auVar288);
        auVar287 = vpackssdw_avx(auVar117._0_16_,auVar117._16_16_);
        auVar289 = vpmovsxwd_avx2(auVar287);
        auVar150 = vblendvps_avx(auVar12,auVar150,auVar289);
        auVar258 = ZEXT3264(auVar150);
        auVar150 = vblendvps_avx(auVar153,auVar231,auVar288);
        auVar198 = vblendvps_avx(auVar198,auVar150,auVar289);
        auVar215._0_8_ = auVar117._0_8_ ^ 0xffffffffffffffff;
        auVar215._8_4_ = auVar117._8_4_ ^ 0xffffffff;
        auVar215._12_4_ = auVar117._12_4_ ^ 0xffffffff;
        auVar215._16_4_ = auVar117._16_4_ ^ 0xffffffff;
        auVar215._20_4_ = auVar117._20_4_ ^ 0xffffffff;
        auVar215._24_4_ = auVar117._24_4_ ^ 0xffffffff;
        auVar215._28_4_ = auVar117._28_4_ ^ 0xffffffff;
        auVar117 = vorps_avx(auVar288,auVar215);
        auVar117 = vandps_avx(auVar238,auVar117);
      }
    }
    auVar241 = ZEXT1664(auVar3);
    auVar150 = local_2c0 & auVar117;
    if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar150 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar150 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar150 >> 0x7f,0) != '\0') ||
          (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar150 >> 0xbf,0) != '\0') ||
        (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar150[0x1f] < '\0') {
      local_640 = ZEXT1632(auVar3);
      fVar261 = *(float *)(ray + k * 4 + 0x80);
      local_580 = ZEXT416((uint)fVar261);
      fVar262 = fVar261 - (float)local_8d0._0_4_;
      auVar214._4_4_ = fVar262;
      auVar214._0_4_ = fVar262;
      auVar214._8_4_ = fVar262;
      auVar214._12_4_ = fVar262;
      auVar214._16_4_ = fVar262;
      auVar214._20_4_ = fVar262;
      auVar214._24_4_ = fVar262;
      auVar214._28_4_ = fVar262;
      local_300 = vminps_avx(auVar214,auVar198);
      auVar52._4_4_ = fVar155 * fVar218;
      auVar52._0_4_ = fVar136 * fVar219;
      auVar52._8_4_ = fVar182 * fVar221;
      auVar52._12_4_ = fVar183 * fVar224;
      auVar52._16_4_ = fVar184 * fVar104;
      auVar52._20_4_ = fVar254 * fVar131;
      auVar52._24_4_ = fVar259 * fVar132;
      auVar52._28_4_ = fVar262;
      auVar3 = vfmadd213ps_fma(auVar249,local_a20,auVar52);
      auVar85._4_4_ = fStack_2dc;
      auVar85._0_4_ = local_2e0;
      auVar85._8_4_ = fStack_2d8;
      auVar85._12_4_ = fStack_2d4;
      auVar85._16_4_ = fStack_2d0;
      auVar85._20_4_ = fStack_2cc;
      auVar85._24_4_ = fStack_2c8;
      auVar85._28_4_ = fStack_2c4;
      auVar12 = vmaxps_avx(auVar85,auVar258._0_32_);
      auVar287 = vfmadd213ps_fma(auVar16,auVar257,ZEXT1632(auVar3));
      auVar53._4_4_ = (float)local_980._4_4_ * fVar155;
      auVar53._0_4_ = (float)local_980._0_4_ * fVar136;
      auVar53._8_4_ = fStack_978 * fVar182;
      auVar53._12_4_ = fStack_974 * fVar183;
      auVar53._16_4_ = fStack_970 * fVar184;
      auVar53._20_4_ = fStack_96c * fVar254;
      auVar53._24_4_ = fStack_968 * fVar259;
      auVar53._28_4_ = uVar103;
      auVar258 = ZEXT3264(_local_a80);
      auVar3 = vfmadd231ps_fma(auVar53,_local_a80,local_a20);
      auVar112 = vfmadd231ps_fma(ZEXT1632(auVar3),_local_800,auVar257);
      auVar150 = vandps_avx(local_860,ZEXT1632(auVar112));
      auVar244._8_4_ = 0x219392ef;
      auVar244._0_8_ = 0x219392ef219392ef;
      auVar244._12_4_ = 0x219392ef;
      auVar244._16_4_ = 0x219392ef;
      auVar244._20_4_ = 0x219392ef;
      auVar244._24_4_ = 0x219392ef;
      auVar244._28_4_ = 0x219392ef;
      auVar249 = vcmpps_avx(auVar150,auVar244,1);
      auVar150 = vrcpps_avx(ZEXT1632(auVar112));
      auVar173._8_4_ = 0x3f800000;
      auVar173._0_8_ = 0x3f8000003f800000;
      auVar173._12_4_ = 0x3f800000;
      auVar173._16_4_ = 0x3f800000;
      auVar173._20_4_ = 0x3f800000;
      auVar173._24_4_ = 0x3f800000;
      auVar173._28_4_ = 0x3f800000;
      auVar238 = ZEXT1632(auVar112);
      auVar3 = vfnmadd213ps_fma(auVar150,auVar238,auVar173);
      auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar150,auVar150);
      auVar279._0_4_ = auVar112._0_4_ ^ local_660;
      auVar279._4_4_ = auVar112._4_4_ ^ uStack_65c;
      auVar279._8_4_ = auVar112._8_4_ ^ uStack_658;
      auVar279._12_4_ = auVar112._12_4_ ^ uStack_654;
      auVar279._16_4_ = fStack_650;
      auVar279._20_4_ = fStack_64c;
      auVar279._24_4_ = fStack_648;
      auVar279._28_4_ = uStack_644;
      auVar54._4_4_ = auVar3._4_4_ * (float)(auVar287._4_4_ ^ uStack_65c);
      auVar54._0_4_ = auVar3._0_4_ * (float)(auVar287._0_4_ ^ local_660);
      auVar54._8_4_ = auVar3._8_4_ * (float)(auVar287._8_4_ ^ uStack_658);
      auVar54._12_4_ = auVar3._12_4_ * (float)(auVar287._12_4_ ^ uStack_654);
      auVar54._16_4_ = fStack_650 * 0.0;
      auVar54._20_4_ = fStack_64c * 0.0;
      auVar54._24_4_ = fStack_648 * 0.0;
      auVar54._28_4_ = uStack_644;
      auVar150 = vcmpps_avx(auVar238,auVar279,1);
      auVar150 = vorps_avx(auVar249,auVar150);
      auVar274._8_4_ = 0xff800000;
      auVar274._0_8_ = 0xff800000ff800000;
      auVar274._12_4_ = 0xff800000;
      auVar274._16_4_ = 0xff800000;
      auVar274._20_4_ = 0xff800000;
      auVar274._24_4_ = 0xff800000;
      auVar274._28_4_ = 0xff800000;
      auVar150 = vblendvps_avx(auVar54,auVar274,auVar150);
      auVar16 = vmaxps_avx(auVar12,auVar150);
      auVar150 = vcmpps_avx(auVar238,auVar279,6);
      auVar150 = vorps_avx(auVar249,auVar150);
      auVar280._8_4_ = 0x7f800000;
      auVar280._0_8_ = 0x7f8000007f800000;
      auVar280._12_4_ = 0x7f800000;
      auVar280._16_4_ = 0x7f800000;
      auVar280._20_4_ = 0x7f800000;
      auVar280._24_4_ = 0x7f800000;
      auVar280._28_4_ = 0x7f800000;
      auVar150 = vblendvps_avx(auVar54,auVar280,auVar150);
      auVar12 = vminps_avx(local_300,auVar150);
      fVar219 = (float)(local_660 ^ (uint)local_9e0._0_4_);
      fVar218 = (float)(uStack_65c ^ (uint)local_9e0._4_4_);
      fVar221 = (float)(uStack_658 ^ (uint)local_9e0._8_4_);
      fVar224 = (float)(uStack_654 ^ (uint)local_9e0._12_4_);
      fVar104 = (float)((uint)fStack_650 ^ (uint)local_9e0._16_4_);
      fVar131 = (float)((uint)fStack_64c ^ (uint)local_9e0._20_4_);
      fVar132 = (float)((uint)fStack_648 ^ (uint)local_9e0._24_4_);
      local_a60._28_4_ = auVar230._28_4_;
      auVar239._0_4_ = local_660 ^ (uint)auVar230._0_4_;
      auVar239._4_4_ = uStack_65c ^ (uint)auVar230._4_4_;
      auVar239._8_4_ = uStack_658 ^ (uint)auVar230._8_4_;
      auVar239._12_4_ = uStack_654 ^ (uint)auVar230._12_4_;
      auVar239._16_4_ = (uint)fStack_650 ^ (uint)auVar230._16_4_;
      auVar239._20_4_ = (uint)fStack_64c ^ (uint)auVar230._20_4_;
      auVar239._24_4_ = (uint)fStack_648 ^ (uint)auVar230._24_4_;
      auVar239._28_4_ = uStack_644 ^ local_a60._28_4_;
      auVar249 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar150 = vsubps_avx(auVar249,auVar171);
      auVar249 = vsubps_avx(auVar249,local_780);
      auVar55._4_4_ = auVar249._4_4_ * fVar218;
      auVar55._0_4_ = auVar249._0_4_ * fVar219;
      auVar55._8_4_ = auVar249._8_4_ * fVar221;
      auVar55._12_4_ = auVar249._12_4_ * fVar224;
      auVar55._16_4_ = auVar249._16_4_ * fVar104;
      auVar55._20_4_ = auVar249._20_4_ * fVar131;
      auVar55._24_4_ = auVar249._24_4_ * fVar132;
      auVar55._28_4_ = auVar249._28_4_;
      auVar3 = vfmadd231ps_fma(auVar55,auVar239,auVar150);
      auVar245._0_4_ = local_660 ^ (uint)local_a40._0_4_;
      auVar245._4_4_ = uStack_65c ^ (uint)local_a40._4_4_;
      auVar245._8_4_ = uStack_658 ^ (uint)local_a40._8_4_;
      auVar245._12_4_ = uStack_654 ^ (uint)local_a40._12_4_;
      auVar245._16_4_ = (uint)fStack_650 ^ (uint)local_a40._16_4_;
      auVar245._20_4_ = (uint)fStack_64c ^ (uint)local_a40._20_4_;
      auVar245._24_4_ = (uint)fStack_648 ^ (uint)local_a40._24_4_;
      auVar245._28_4_ = uStack_644 ^ uStack_a24;
      auVar150 = vsubps_avx(ZEXT1232(ZEXT812(0)) << 0x20,auVar143);
      auVar287 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar245,auVar150);
      auVar56._4_4_ = (float)local_980._4_4_ * fVar218;
      auVar56._0_4_ = (float)local_980._0_4_ * fVar219;
      auVar56._8_4_ = fStack_978 * fVar221;
      auVar56._12_4_ = fStack_974 * fVar224;
      auVar56._16_4_ = fStack_970 * fVar104;
      auVar56._20_4_ = fStack_96c * fVar131;
      auVar56._24_4_ = fStack_968 * fVar132;
      auVar56._28_4_ = uStack_644 ^ local_9e0._28_4_;
      auVar3 = vfmadd231ps_fma(auVar56,_local_a80,auVar239);
      auVar112 = vfmadd231ps_fma(ZEXT1632(auVar3),_local_800,auVar245);
      auVar150 = vandps_avx(local_860,ZEXT1632(auVar112));
      auVar143 = vrcpps_avx(ZEXT1632(auVar112));
      auVar201._8_4_ = 0x219392ef;
      auVar201._0_8_ = 0x219392ef219392ef;
      auVar201._12_4_ = 0x219392ef;
      auVar201._16_4_ = 0x219392ef;
      auVar201._20_4_ = 0x219392ef;
      auVar201._24_4_ = 0x219392ef;
      auVar201._28_4_ = 0x219392ef;
      auVar249 = vcmpps_avx(auVar150,auVar201,1);
      auVar241 = ZEXT3264(auVar249);
      auVar171 = ZEXT1632(auVar112);
      auVar3 = vfnmadd213ps_fma(auVar143,auVar171,auVar173);
      auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar143,auVar143);
      auVar246._0_4_ = auVar112._0_4_ ^ local_660;
      auVar246._4_4_ = auVar112._4_4_ ^ uStack_65c;
      auVar246._8_4_ = auVar112._8_4_ ^ uStack_658;
      auVar246._12_4_ = auVar112._12_4_ ^ uStack_654;
      auVar246._16_4_ = fStack_650;
      auVar246._20_4_ = fStack_64c;
      auVar246._24_4_ = fStack_648;
      auVar246._28_4_ = uStack_644;
      auVar57._4_4_ = auVar3._4_4_ * (float)(auVar287._4_4_ ^ uStack_65c);
      auVar57._0_4_ = auVar3._0_4_ * (float)(auVar287._0_4_ ^ local_660);
      auVar57._8_4_ = auVar3._8_4_ * (float)(auVar287._8_4_ ^ uStack_658);
      auVar57._12_4_ = auVar3._12_4_ * (float)(auVar287._12_4_ ^ uStack_654);
      auVar57._16_4_ = fStack_650 * 0.0;
      auVar57._20_4_ = fStack_64c * 0.0;
      auVar57._24_4_ = fStack_648 * 0.0;
      auVar57._28_4_ = uStack_644;
      auVar268 = ZEXT3264(auVar57);
      auVar150 = vcmpps_avx(auVar171,auVar246,1);
      auVar150 = vorps_avx(auVar150,auVar249);
      auVar120._8_4_ = 0xff800000;
      auVar120._0_8_ = 0xff800000ff800000;
      auVar120._12_4_ = 0xff800000;
      auVar120._16_4_ = 0xff800000;
      auVar120._20_4_ = 0xff800000;
      auVar120._24_4_ = 0xff800000;
      auVar120._28_4_ = 0xff800000;
      auVar150 = vblendvps_avx(auVar57,auVar120,auVar150);
      auVar277 = ZEXT3264(auVar150);
      _local_840 = vmaxps_avx(auVar16,auVar150);
      auVar150 = vcmpps_avx(auVar171,auVar246,6);
      auVar150 = vorps_avx(auVar249,auVar150);
      auVar121._8_4_ = 0x7f800000;
      auVar121._0_8_ = 0x7f8000007f800000;
      auVar121._12_4_ = 0x7f800000;
      auVar121._16_4_ = 0x7f800000;
      auVar121._20_4_ = 0x7f800000;
      auVar121._24_4_ = 0x7f800000;
      auVar121._28_4_ = 0x7f800000;
      auVar150 = vblendvps_avx(auVar57,auVar121,auVar150);
      auVar117 = vandps_avx(local_2c0,auVar117);
      local_380 = vminps_avx(auVar12,auVar150);
      auVar150 = vcmpps_avx(_local_840,local_380,2);
      auVar249 = auVar117 & auVar150;
      if ((((((((auVar249 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar249 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar249 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar249 >> 0x7f,0) != '\0') ||
            (auVar249 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar249 >> 0xbf,0) != '\0') ||
          (auVar249 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar249[0x1f] < '\0') {
        auVar249 = vminps_avx(local_340,auVar173);
        auVar277 = ZEXT864(0) << 0x20;
        auVar249 = vmaxps_avx(auVar249,ZEXT832(0) << 0x20);
        auVar84._4_4_ = fStack_35c;
        auVar84._0_4_ = local_360;
        auVar84._8_4_ = fStack_358;
        auVar84._12_4_ = fStack_354;
        auVar84._16_4_ = uStack_350;
        auVar84._20_4_ = uStack_34c;
        auVar84._24_4_ = uStack_348;
        auVar84._28_4_ = uStack_344;
        auVar16 = vminps_avx(auVar84,auVar173);
        auVar16 = vmaxps_avx(auVar16,ZEXT832(0) << 0x20);
        fVar219 = DAT_01faff40._28_4_;
        auVar58._4_4_ = (auVar249._4_4_ + DAT_01faff40._4_4_) * 0.125;
        auVar58._0_4_ = (auVar249._0_4_ + (float)DAT_01faff40) * 0.125;
        auVar58._8_4_ = (auVar249._8_4_ + DAT_01faff40._8_4_) * 0.125;
        auVar58._12_4_ = (auVar249._12_4_ + DAT_01faff40._12_4_) * 0.125;
        auVar58._16_4_ = (auVar249._16_4_ + DAT_01faff40._16_4_) * 0.125;
        auVar58._20_4_ = (auVar249._20_4_ + DAT_01faff40._20_4_) * 0.125;
        auVar58._24_4_ = (auVar249._24_4_ + DAT_01faff40._24_4_) * 0.125;
        auVar58._28_4_ = auVar249._28_4_ + fVar219;
        auVar3 = vfmadd213ps_fma(auVar58,local_940,local_a00);
        auVar59._4_4_ = (auVar16._4_4_ + DAT_01faff40._4_4_) * 0.125;
        auVar59._0_4_ = (auVar16._0_4_ + (float)DAT_01faff40) * 0.125;
        auVar59._8_4_ = (auVar16._8_4_ + DAT_01faff40._8_4_) * 0.125;
        auVar59._12_4_ = (auVar16._12_4_ + DAT_01faff40._12_4_) * 0.125;
        auVar59._16_4_ = (auVar16._16_4_ + DAT_01faff40._16_4_) * 0.125;
        auVar59._20_4_ = (auVar16._20_4_ + DAT_01faff40._20_4_) * 0.125;
        auVar59._24_4_ = (auVar16._24_4_ + DAT_01faff40._24_4_) * 0.125;
        auVar59._28_4_ = auVar16._28_4_ + fVar219;
        auVar287 = vfmadd213ps_fma(auVar59,local_940,local_a00);
        auVar249 = vminps_avx(local_7a0,local_7c0);
        auVar16 = vminps_avx(local_7e0,auVar237);
        auVar249 = vminps_avx(auVar249,auVar16);
        auVar13 = vsubps_avx(auVar249,auVar13);
        auVar117 = vandps_avx(auVar150,auVar117);
        local_1a0 = ZEXT1632(auVar3);
        local_1c0 = ZEXT1632(auVar287);
        auVar60._4_4_ = auVar13._4_4_ * 0.99999976;
        auVar60._0_4_ = auVar13._0_4_ * 0.99999976;
        auVar60._8_4_ = auVar13._8_4_ * 0.99999976;
        auVar60._12_4_ = auVar13._12_4_ * 0.99999976;
        auVar60._16_4_ = auVar13._16_4_ * 0.99999976;
        auVar60._20_4_ = auVar13._20_4_ * 0.99999976;
        auVar60._24_4_ = auVar13._24_4_ * 0.99999976;
        auVar60._28_4_ = auVar13._28_4_;
        auVar150 = vmaxps_avx(ZEXT832(0) << 0x20,auVar60);
        auVar61._4_4_ = auVar150._4_4_ * auVar150._4_4_;
        auVar61._0_4_ = auVar150._0_4_ * auVar150._0_4_;
        auVar61._8_4_ = auVar150._8_4_ * auVar150._8_4_;
        auVar61._12_4_ = auVar150._12_4_ * auVar150._12_4_;
        auVar61._16_4_ = auVar150._16_4_ * auVar150._16_4_;
        auVar61._20_4_ = auVar150._20_4_ * auVar150._20_4_;
        auVar61._24_4_ = auVar150._24_4_ * auVar150._24_4_;
        auVar61._28_4_ = auVar150._28_4_;
        auVar13 = vsubps_avx(auVar14,auVar61);
        auVar62._4_4_ = auVar13._4_4_ * fVar220 * 4.0;
        auVar62._0_4_ = auVar13._0_4_ * fVar217 * 4.0;
        auVar62._8_4_ = auVar13._8_4_ * fVar223 * 4.0;
        auVar62._12_4_ = auVar13._12_4_ * fVar133 * 4.0;
        auVar62._16_4_ = auVar13._16_4_ * fVar134 * 4.0;
        auVar62._20_4_ = auVar13._20_4_ * fVar135 * 4.0;
        auVar62._24_4_ = auVar13._24_4_ * fVar260 * 4.0;
        auVar62._28_4_ = auVar150._28_4_;
        auVar14 = vsubps_avx(auVar243,auVar62);
        auVar268 = ZEXT3264(auVar14);
        auVar150 = vcmpps_avx(auVar14,ZEXT832(0) << 0x20,5);
        if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar150 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar150 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar150 >> 0x7f,0) == '\0') &&
              (auVar150 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar150 >> 0xbf,0) == '\0') &&
            (auVar150 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar150[0x1f]) {
          auVar122 = SUB6432(ZEXT864(0),0) << 0x20;
          local_8a0 = ZEXT832(0) << 0x20;
          _local_680 = ZEXT832(0) << 0x20;
          auVar147 = ZEXT832(0) << 0x40;
          auVar180 = ZEXT864(0) << 0x20;
          auVar240._8_4_ = 0x7f800000;
          auVar240._0_8_ = 0x7f8000007f800000;
          auVar240._12_4_ = 0x7f800000;
          auVar240._16_4_ = 0x7f800000;
          auVar240._20_4_ = 0x7f800000;
          auVar240._24_4_ = 0x7f800000;
          auVar240._28_4_ = 0x7f800000;
          auVar247._8_4_ = 0xff800000;
          auVar247._0_8_ = 0xff800000ff800000;
          auVar247._12_4_ = 0xff800000;
          auVar247._16_4_ = 0xff800000;
          auVar247._20_4_ = 0xff800000;
          auVar247._24_4_ = 0xff800000;
          auVar247._28_4_ = 0xff800000;
          local_880 = local_8a0;
        }
        else {
          auVar16 = vsqrtps_avx(auVar14);
          auVar248._0_4_ = fVar217 + fVar217;
          auVar248._4_4_ = fVar220 + fVar220;
          auVar248._8_4_ = fVar223 + fVar223;
          auVar248._12_4_ = fVar133 + fVar133;
          auVar248._16_4_ = fVar134 + fVar134;
          auVar248._20_4_ = fVar135 + fVar135;
          auVar248._24_4_ = fVar260 + fVar260;
          auVar248._28_4_ = fVar204 + fVar204;
          auVar249 = vrcpps_avx(auVar248);
          auVar3 = vfnmadd213ps_fma(auVar248,auVar249,auVar173);
          auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar249,auVar249);
          auVar275._0_4_ = (uint)local_2a0._0_4_ ^ local_660;
          auVar275._4_4_ = (uint)local_2a0._4_4_ ^ uStack_65c;
          auVar275._8_4_ = (uint)local_2a0._8_4_ ^ uStack_658;
          auVar275._12_4_ = (uint)local_2a0._12_4_ ^ uStack_654;
          auVar275._16_4_ = (uint)local_2a0._16_4_ ^ (uint)fStack_650;
          auVar275._20_4_ = (uint)local_2a0._20_4_ ^ (uint)fStack_64c;
          auVar275._24_4_ = (uint)local_2a0._24_4_ ^ (uint)fStack_648;
          auVar275._28_4_ = (uint)local_2a0._28_4_ ^ uStack_644;
          auVar249 = vsubps_avx(auVar275,auVar16);
          auVar12 = vsubps_avx(auVar16,local_2a0);
          fVar204 = auVar249._0_4_ * auVar3._0_4_;
          fVar218 = auVar249._4_4_ * auVar3._4_4_;
          auVar63._4_4_ = fVar218;
          auVar63._0_4_ = fVar204;
          fVar217 = auVar249._8_4_ * auVar3._8_4_;
          auVar63._8_4_ = fVar217;
          fVar221 = auVar249._12_4_ * auVar3._12_4_;
          auVar63._12_4_ = fVar221;
          fVar220 = auVar249._16_4_ * 0.0;
          auVar63._16_4_ = fVar220;
          fVar224 = auVar249._20_4_ * 0.0;
          auVar63._20_4_ = fVar224;
          fVar223 = auVar249._24_4_ * 0.0;
          auVar63._24_4_ = fVar223;
          auVar63._28_4_ = auVar16._28_4_;
          fVar104 = auVar12._0_4_ * auVar3._0_4_;
          fVar131 = auVar12._4_4_ * auVar3._4_4_;
          auVar64._4_4_ = fVar131;
          auVar64._0_4_ = fVar104;
          fVar132 = auVar12._8_4_ * auVar3._8_4_;
          auVar64._8_4_ = fVar132;
          fVar133 = auVar12._12_4_ * auVar3._12_4_;
          auVar64._12_4_ = fVar133;
          fVar134 = auVar12._16_4_ * 0.0;
          auVar64._16_4_ = fVar134;
          fVar135 = auVar12._20_4_ * 0.0;
          auVar64._20_4_ = fVar135;
          fVar136 = auVar12._24_4_ * 0.0;
          auVar64._24_4_ = fVar136;
          auVar64._28_4_ = auVar249._28_4_;
          auVar277 = ZEXT3264(auVar64);
          auVar3 = vfmadd213ps_fma(auVar256,auVar63,auVar282);
          auVar287 = vfmadd213ps_fma(auVar256,auVar64,auVar282);
          auVar249 = ZEXT1632(CONCAT412(auVar3._12_4_ * fVar270,
                                        CONCAT48(auVar3._8_4_ * fVar253,
                                                 CONCAT44(auVar3._4_4_ * fVar222,
                                                          auVar3._0_4_ * fVar216))));
          auVar65._28_4_ = local_a80._28_4_;
          auVar65._0_28_ =
               ZEXT1628(CONCAT412(auVar287._12_4_ * fVar270,
                                  CONCAT48(auVar287._8_4_ * fVar253,
                                           CONCAT44(auVar287._4_4_ * fVar222,
                                                    auVar287._0_4_ * fVar216))));
          auVar3 = vfmadd213ps_fma(auVar15,auVar249,auVar118);
          auVar287 = vfmadd213ps_fma(auVar15,auVar65,auVar118);
          auVar112 = vfmadd213ps_fma(auVar147,auVar249,local_960);
          auVar106 = vfmadd213ps_fma(auVar147,auVar65,local_960);
          auVar225 = vfmadd213ps_fma(auVar249,auVar122,auVar172);
          auVar166 = vfmadd213ps_fma(auVar122,auVar65,auVar172);
          auVar66._4_4_ = (float)local_800._4_4_ * fVar218;
          auVar66._0_4_ = (float)local_800._0_4_ * fVar204;
          auVar66._8_4_ = fStack_7f8 * fVar217;
          auVar66._12_4_ = fStack_7f4 * fVar221;
          auVar66._16_4_ = fStack_7f0 * fVar220;
          auVar66._20_4_ = fStack_7ec * fVar224;
          auVar66._24_4_ = fStack_7e8 * fVar223;
          auVar66._28_4_ = 0;
          auVar122 = vsubps_avx(auVar66,ZEXT1632(auVar3));
          auVar91._4_4_ = (float)local_a80._4_4_ * fVar218;
          auVar91._0_4_ = (float)local_a80._0_4_ * fVar204;
          auVar91._8_4_ = fStack_a78 * fVar217;
          auVar91._12_4_ = fStack_a74 * fVar221;
          auVar91._16_4_ = fStack_a70 * fVar220;
          auVar91._20_4_ = fStack_a6c * fVar224;
          auVar91._24_4_ = fStack_a68 * fVar223;
          auVar91._28_4_ = fVar219;
          auVar147 = vsubps_avx(auVar91,ZEXT1632(auVar112));
          auVar174._0_4_ = (float)local_980._0_4_ * fVar204;
          auVar174._4_4_ = (float)local_980._4_4_ * fVar218;
          auVar174._8_4_ = fStack_978 * fVar217;
          auVar174._12_4_ = fStack_974 * fVar221;
          auVar174._16_4_ = fStack_970 * fVar220;
          auVar174._20_4_ = fStack_96c * fVar224;
          auVar174._24_4_ = fStack_968 * fVar223;
          auVar174._28_4_ = 0;
          auVar15 = vsubps_avx(auVar174,ZEXT1632(auVar225));
          auVar180 = ZEXT3264(auVar15);
          auVar250._0_4_ = (float)local_800._0_4_ * fVar104;
          auVar250._4_4_ = (float)local_800._4_4_ * fVar131;
          auVar250._8_4_ = fStack_7f8 * fVar132;
          auVar250._12_4_ = fStack_7f4 * fVar133;
          auVar250._16_4_ = fStack_7f0 * fVar134;
          auVar250._20_4_ = fStack_7ec * fVar135;
          auVar250._24_4_ = fStack_7e8 * fVar136;
          auVar250._28_4_ = 0;
          local_880 = vsubps_avx(auVar250,ZEXT1632(auVar287));
          auVar67._4_4_ = (float)local_a80._4_4_ * fVar131;
          auVar67._0_4_ = (float)local_a80._0_4_ * fVar104;
          auVar67._8_4_ = fStack_a78 * fVar132;
          auVar67._12_4_ = fStack_a74 * fVar133;
          auVar67._16_4_ = fStack_a70 * fVar134;
          auVar67._20_4_ = fStack_a6c * fVar135;
          auVar67._24_4_ = fStack_a68 * fVar136;
          auVar67._28_4_ = local_880._28_4_;
          local_8a0 = vsubps_avx(auVar67,ZEXT1632(auVar106));
          auVar68._4_4_ = (float)local_980._4_4_ * fVar131;
          auVar68._0_4_ = (float)local_980._0_4_ * fVar104;
          auVar68._8_4_ = fStack_978 * fVar132;
          auVar68._12_4_ = fStack_974 * fVar133;
          auVar68._16_4_ = fStack_970 * fVar134;
          auVar68._20_4_ = fStack_96c * fVar135;
          auVar68._24_4_ = fStack_968 * fVar136;
          auVar68._28_4_ = local_8a0._28_4_;
          _local_680 = vsubps_avx(auVar68,ZEXT1632(auVar166));
          auVar272 = ZEXT864(0) << 0x20;
          auVar15 = vcmpps_avx(auVar14,_DAT_01faff00,5);
          auVar251._8_4_ = 0x7f800000;
          auVar251._0_8_ = 0x7f8000007f800000;
          auVar251._12_4_ = 0x7f800000;
          auVar251._16_4_ = 0x7f800000;
          auVar251._20_4_ = 0x7f800000;
          auVar251._24_4_ = 0x7f800000;
          auVar251._28_4_ = 0x7f800000;
          auVar240 = vblendvps_avx(auVar251,auVar63,auVar15);
          auVar14 = vandps_avx(local_860,auVar47);
          auVar14 = vmaxps_avx(local_560,auVar14);
          auVar69._4_4_ = auVar14._4_4_ * 1.9073486e-06;
          auVar69._0_4_ = auVar14._0_4_ * 1.9073486e-06;
          auVar69._8_4_ = auVar14._8_4_ * 1.9073486e-06;
          auVar69._12_4_ = auVar14._12_4_ * 1.9073486e-06;
          auVar69._16_4_ = auVar14._16_4_ * 1.9073486e-06;
          auVar69._20_4_ = auVar14._20_4_ * 1.9073486e-06;
          auVar69._24_4_ = auVar14._24_4_ * 1.9073486e-06;
          auVar69._28_4_ = auVar14._28_4_;
          auVar14 = vandps_avx(local_860,auVar11);
          auVar14 = vcmpps_avx(auVar14,auVar69,1);
          auVar268 = ZEXT3264(auVar14);
          auVar252._8_4_ = 0xff800000;
          auVar252._0_8_ = 0xff800000ff800000;
          auVar252._12_4_ = 0xff800000;
          auVar252._16_4_ = 0xff800000;
          auVar252._20_4_ = 0xff800000;
          auVar252._24_4_ = 0xff800000;
          auVar252._28_4_ = 0xff800000;
          auVar247 = vblendvps_avx(auVar252,auVar64,auVar15);
          auVar249 = auVar15 & auVar14;
          if ((((((((auVar249 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar249 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar249 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar249 >> 0x7f,0) != '\0') ||
                (auVar249 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar249 >> 0xbf,0) != '\0') ||
              (auVar249 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar249[0x1f] < '\0') {
            auVar150 = vandps_avx(auVar14,auVar15);
            auVar14 = vcmpps_avx(auVar13,ZEXT832(0) << 0x20,2);
            auVar276._8_4_ = 0xff800000;
            auVar276._0_8_ = 0xff800000ff800000;
            auVar276._12_4_ = 0xff800000;
            auVar276._16_4_ = 0xff800000;
            auVar276._20_4_ = 0xff800000;
            auVar276._24_4_ = 0xff800000;
            auVar276._28_4_ = 0xff800000;
            auVar277 = ZEXT3264(auVar276);
            auVar281._8_4_ = 0x7f800000;
            auVar281._0_8_ = 0x7f8000007f800000;
            auVar281._12_4_ = 0x7f800000;
            auVar281._16_4_ = 0x7f800000;
            auVar281._20_4_ = 0x7f800000;
            auVar281._24_4_ = 0x7f800000;
            auVar281._28_4_ = 0x7f800000;
            auVar13 = vblendvps_avx(auVar281,auVar276,auVar14);
            auVar3 = vpackssdw_avx(auVar150._0_16_,auVar150._16_16_);
            auVar249 = vpmovsxwd_avx2(auVar3);
            auVar268 = ZEXT3264(auVar249);
            auVar240 = vblendvps_avx(auVar240,auVar13,auVar249);
            auVar13 = vblendvps_avx(auVar276,auVar281,auVar14);
            auVar272 = ZEXT3264(auVar13);
            auVar247 = vblendvps_avx(auVar247,auVar13,auVar249);
            auVar232._0_8_ = auVar150._0_8_ ^ 0xffffffffffffffff;
            auVar232._8_4_ = auVar150._8_4_ ^ 0xffffffff;
            auVar232._12_4_ = auVar150._12_4_ ^ 0xffffffff;
            auVar232._16_4_ = auVar150._16_4_ ^ 0xffffffff;
            auVar232._20_4_ = auVar150._20_4_ ^ 0xffffffff;
            auVar232._24_4_ = auVar150._24_4_ ^ 0xffffffff;
            auVar232._28_4_ = auVar150._28_4_ ^ 0xffffffff;
            auVar150 = vorps_avx(auVar14,auVar232);
            auVar150 = vandps_avx(auVar15,auVar150);
          }
        }
        auVar258 = ZEXT3264(_local_840);
        local_3e0 = _local_840;
        local_3c0 = vminps_avx(local_380,auVar240);
        local_a60 = vmaxps_avx(_local_840,auVar247);
        auVar241 = ZEXT3264(local_a60);
        local_3a0 = local_a60;
        auVar13 = vcmpps_avx(_local_840,local_3c0,2);
        local_6a0 = vandps_avx(auVar13,auVar117);
        auVar13 = vcmpps_avx(local_a60,local_380,2);
        local_620 = vandps_avx(auVar13,auVar117);
        auVar117 = vorps_avx(local_620,local_6a0);
        if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar117 >> 0x7f,0) != '\0') ||
              (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar117 >> 0xbf,0) != '\0') ||
            (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar117[0x1f] < '\0') {
          local_5e0._0_8_ = auVar150._0_8_ ^ 0xffffffffffffffff;
          local_5e0._8_4_ = auVar150._8_4_ ^ 0xffffffff;
          local_5e0._12_4_ = auVar150._12_4_ ^ 0xffffffff;
          local_5e0._16_4_ = auVar150._16_4_ ^ 0xffffffff;
          local_5e0._20_4_ = auVar150._20_4_ ^ 0xffffffff;
          local_5e0._24_4_ = auVar150._24_4_ ^ 0xffffffff;
          local_5e0._28_4_ = auVar150._28_4_ ^ 0xffffffff;
          auVar181._0_4_ = (float)local_980._0_4_ * auVar180._0_4_;
          auVar181._4_4_ = (float)local_980._4_4_ * auVar180._4_4_;
          auVar181._8_4_ = fStack_978 * auVar180._8_4_;
          auVar181._12_4_ = fStack_974 * auVar180._12_4_;
          auVar181._16_4_ = fStack_970 * auVar180._16_4_;
          auVar181._20_4_ = fStack_96c * auVar180._20_4_;
          auVar181._28_36_ = auVar180._28_36_;
          auVar181._24_4_ = fStack_968 * auVar180._24_4_;
          auVar3 = vfmadd213ps_fma(auVar147,_local_a80,auVar181._0_32_);
          auVar3 = vfmadd213ps_fma(auVar122,_local_800,ZEXT1632(auVar3));
          auVar117 = vandps_avx(ZEXT1632(auVar3),local_860);
          auVar148._8_4_ = 0x3e99999a;
          auVar148._0_8_ = 0x3e99999a3e99999a;
          auVar148._12_4_ = 0x3e99999a;
          auVar148._16_4_ = 0x3e99999a;
          auVar148._20_4_ = 0x3e99999a;
          auVar148._24_4_ = 0x3e99999a;
          auVar148._28_4_ = 0x3e99999a;
          auVar117 = vcmpps_avx(auVar117,auVar148,1);
          auVar117 = vorps_avx(auVar117,local_5e0);
          auVar149._8_4_ = 3;
          auVar149._0_8_ = 0x300000003;
          auVar149._12_4_ = 3;
          auVar149._16_4_ = 3;
          auVar149._20_4_ = 3;
          auVar149._24_4_ = 3;
          auVar149._28_4_ = 3;
          auVar175._8_4_ = 2;
          auVar175._0_8_ = 0x200000002;
          auVar175._12_4_ = 2;
          auVar175._16_4_ = 2;
          auVar175._20_4_ = 2;
          auVar175._24_4_ = 2;
          auVar175._28_4_ = 2;
          auVar117 = vblendvps_avx(auVar175,auVar149,auVar117);
          local_600._4_4_ = local_be8;
          local_600._0_4_ = local_be8;
          local_600._8_4_ = local_be8;
          local_600._12_4_ = local_be8;
          local_600._16_4_ = local_be8;
          local_600._20_4_ = local_be8;
          local_600._24_4_ = local_be8;
          local_600._28_4_ = local_be8;
          local_5c0 = vpcmpgtd_avx2(auVar117,local_600);
          local_5a0 = vpandn_avx2(local_5c0,local_6a0);
          auVar180 = ZEXT3264(local_5a0);
          auVar117 = local_6a0 & ~local_5c0;
          fStack_b5c = auVar2._4_4_;
          fStack_b58 = auVar2._8_4_;
          fStack_b54 = auVar2._12_4_;
          if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar117 >> 0x7f,0) == '\0') &&
                (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar117 >> 0xbf,0) == '\0') &&
              (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar117[0x1f]) {
            auVar123._4_4_ = fVar261;
            auVar123._0_4_ = fVar261;
            auVar123._8_4_ = fVar261;
            auVar123._12_4_ = fVar261;
            auVar123._16_4_ = fVar261;
            auVar123._20_4_ = fVar261;
            auVar123._24_4_ = fVar261;
            auVar123._28_4_ = fVar261;
            auVar117 = local_620;
            fVar204 = (float)local_980._0_4_;
            fVar219 = (float)local_980._4_4_;
            fVar218 = fStack_978;
            fVar217 = fStack_974;
            fVar253 = fStack_970;
            fVar221 = fStack_96c;
            fVar220 = fStack_968;
            local_a60 = auVar230;
            local_620 = auVar47;
          }
          else {
            auVar287 = vminps_avx(auVar4,auVar5);
            auVar3 = vmaxps_avx(auVar4,auVar5);
            auVar112 = vminps_avx(auVar1,auVar2);
            auVar106 = vminps_avx(auVar287,auVar112);
            auVar287 = vmaxps_avx(auVar1,auVar2);
            auVar112 = vmaxps_avx(auVar3,auVar287);
            auVar185._8_4_ = 0x7fffffff;
            auVar185._0_8_ = 0x7fffffff7fffffff;
            auVar185._12_4_ = 0x7fffffff;
            auVar3 = vandps_avx(auVar106,auVar185);
            local_a40._0_16_ = auVar185;
            auVar287 = vandps_avx(auVar112,auVar185);
            auVar3 = vmaxps_avx(auVar3,auVar287);
            auVar287 = vmovshdup_avx(auVar3);
            auVar287 = vmaxss_avx(auVar287,auVar3);
            auVar3 = vshufpd_avx(auVar3,auVar3,1);
            auVar3 = vmaxss_avx(auVar3,auVar287);
            local_960 = ZEXT1632(CONCAT124(auVar110._4_12_,auVar3._0_4_ * 1.9073486e-06));
            auVar3 = vshufps_avx(auVar112,auVar112,0xff);
            local_820._4_4_ = (float)local_840._4_4_ + (float)local_920._4_4_;
            local_820._0_4_ = (float)local_840._0_4_ + (float)local_920._0_4_;
            fStack_818 = fStack_838 + fStack_918;
            fStack_814 = fStack_834 + fStack_914;
            fStack_810 = fStack_830 + fStack_910;
            fStack_80c = fStack_82c + fStack_90c;
            fStack_808 = fStack_828 + fStack_908;
            fStack_804 = fStack_824 + fStack_904;
            do {
              auVar124._8_4_ = 0x7f800000;
              auVar124._0_8_ = 0x7f8000007f800000;
              auVar124._12_4_ = 0x7f800000;
              auVar124._16_4_ = 0x7f800000;
              auVar124._20_4_ = 0x7f800000;
              auVar124._24_4_ = 0x7f800000;
              auVar124._28_4_ = 0x7f800000;
              auVar117 = auVar180._0_32_;
              auVar150 = vblendvps_avx(auVar124,_local_840,auVar117);
              auVar13 = vshufps_avx(auVar150,auVar150,0xb1);
              auVar13 = vminps_avx(auVar150,auVar13);
              auVar14 = vshufpd_avx(auVar13,auVar13,5);
              auVar13 = vminps_avx(auVar13,auVar14);
              auVar14 = vpermpd_avx2(auVar13,0x4e);
              auVar13 = vminps_avx(auVar13,auVar14);
              auVar150 = vcmpps_avx(auVar150,auVar13,0);
              auVar13 = auVar117 & auVar150;
              if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar13 >> 0x7f,0) != '\0') ||
                    (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar13 >> 0xbf,0) != '\0') ||
                  (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar13[0x1f] < '\0') {
                auVar117 = vandps_avx(auVar150,auVar117);
              }
              uVar94 = vmovmskps_avx(auVar117);
              iVar17 = 0;
              for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
                iVar17 = iVar17 + 1;
              }
              uVar95 = iVar17 << 2;
              *(undefined4 *)(local_5a0 + uVar95) = 0;
              uVar94 = *(uint *)(local_1a0 + uVar95);
              uVar95 = *(uint *)(local_3e0 + uVar95);
              fVar204 = auVar9._0_4_;
              if ((float)local_9a0._0_4_ < 0.0) {
                fVar204 = sqrtf((float)local_9a0._0_4_);
              }
              local_9e0._0_4_ = fVar204 * 1.9073486e-06;
              auVar110 = vinsertps_avx(ZEXT416(uVar95),ZEXT416(uVar94),0x10);
              auVar258 = ZEXT1664(auVar110);
              bVar100 = true;
              uVar98 = 0;
              do {
                auVar166 = auVar258._0_16_;
                auVar287 = vmovshdup_avx(auVar166);
                fVar216 = auVar287._0_4_;
                fVar217 = 1.0 - fVar216;
                fVar222 = fVar217 * fVar217 * fVar217;
                fVar218 = fVar216 * fVar216;
                fVar219 = fVar216 * fVar218;
                auVar112 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar222),
                                           ZEXT416((uint)fVar219));
                fVar204 = fVar216 * fVar217;
                auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar216 * fVar204 * 6.0)),
                                           ZEXT416((uint)(fVar217 * fVar204)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar225 = vfmadd231ss_fma(ZEXT416((uint)(fVar217 * fVar204 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar216 * fVar204)));
                auVar110 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar219),
                                           ZEXT416((uint)fVar222));
                fVar216 = (auVar110._0_4_ + auVar225._0_4_) * 0.16666667;
                fVar219 = fVar219 * 0.16666667;
                auVar137._0_4_ = fVar219 * fVar130;
                auVar137._4_4_ = fVar219 * fStack_b5c;
                auVar137._8_4_ = fVar219 * fStack_b58;
                auVar137._12_4_ = fVar219 * fStack_b54;
                auVar186._4_4_ = fVar216;
                auVar186._0_4_ = fVar216;
                auVar186._8_4_ = fVar216;
                auVar186._12_4_ = fVar216;
                auVar110 = vfmadd132ps_fma(auVar186,auVar137,auVar1);
                fVar216 = (auVar112._0_4_ + auVar106._0_4_) * 0.16666667;
                auVar138._4_4_ = fVar216;
                auVar138._0_4_ = fVar216;
                auVar138._8_4_ = fVar216;
                auVar138._12_4_ = fVar216;
                auVar110 = vfmadd132ps_fma(auVar138,auVar110,auVar5);
                fVar219 = auVar258._0_4_;
                auVar156._4_4_ = fVar219;
                auVar156._0_4_ = fVar219;
                auVar156._8_4_ = fVar219;
                auVar156._12_4_ = fVar219;
                auVar112 = vfmadd213ps_fma(auVar156,local_990,_DAT_01f7aa10);
                fVar222 = fVar222 * 0.16666667;
                auVar105._4_4_ = fVar222;
                auVar105._0_4_ = fVar222;
                auVar105._8_4_ = fVar222;
                auVar105._12_4_ = fVar222;
                auVar110 = vfmadd132ps_fma(auVar105,auVar110,auVar4);
                local_780._0_16_ = auVar110;
                auVar112 = vsubps_avx(auVar112,auVar110);
                auVar110 = vdpps_avx(auVar112,auVar112,0x7f);
                fVar216 = auVar110._0_4_;
                if (fVar216 < 0.0) {
                  local_a20._0_4_ = fVar218;
                  local_9c0._0_4_ = fVar204;
                  auVar268._0_4_ = sqrtf(fVar216);
                  auVar268._4_60_ = extraout_var;
                  auVar106 = auVar268._0_16_;
                  fVar218 = (float)local_a20._0_4_;
                }
                else {
                  auVar106 = vsqrtss_avx(auVar110,auVar110);
                  local_9c0._0_4_ = fVar204;
                }
                auVar273 = ZEXT416((uint)fVar217);
                auVar107._4_4_ = fVar217;
                auVar107._0_4_ = fVar217;
                auVar107._8_4_ = fVar217;
                auVar107._12_4_ = fVar217;
                auVar265 = vfnmsub213ss_fma(auVar287,auVar287,
                                            ZEXT416((uint)((float)local_9c0._0_4_ * 4.0)));
                auVar225 = vfmadd231ss_fma(ZEXT416((uint)((float)local_9c0._0_4_ * 4.0)),auVar273,
                                           auVar273);
                fVar204 = fVar217 * -fVar217 * 0.5;
                fVar222 = auVar265._0_4_ * 0.5;
                fVar217 = auVar225._0_4_ * 0.5;
                fVar218 = fVar218 * 0.5;
                auVar226._0_4_ = fVar130 * fVar218;
                auVar226._4_4_ = fStack_b5c * fVar218;
                auVar226._8_4_ = fStack_b58 * fVar218;
                auVar226._12_4_ = fStack_b54 * fVar218;
                auVar187._4_4_ = fVar217;
                auVar187._0_4_ = fVar217;
                auVar187._8_4_ = fVar217;
                auVar187._12_4_ = fVar217;
                auVar225 = vfmadd213ps_fma(auVar187,auVar1,auVar226);
                auVar205._4_4_ = fVar222;
                auVar205._0_4_ = fVar222;
                auVar205._8_4_ = fVar222;
                auVar205._12_4_ = fVar222;
                auVar225 = vfmadd213ps_fma(auVar205,auVar5,auVar225);
                auVar266._4_4_ = fVar204;
                auVar266._0_4_ = fVar204;
                auVar266._8_4_ = fVar204;
                auVar266._12_4_ = fVar204;
                auVar271 = vfmadd213ps_fma(auVar266,auVar4,auVar225);
                auVar225 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar273,auVar287);
                auVar265 = vfmadd213ss_fma(auVar287,SUB6416(ZEXT464(0xc0000000),0),auVar273);
                auVar287 = vshufps_avx(auVar166,auVar166,0x55);
                auVar188._0_4_ = fVar130 * auVar287._0_4_;
                auVar188._4_4_ = fStack_b5c * auVar287._4_4_;
                auVar188._8_4_ = fStack_b58 * auVar287._8_4_;
                auVar188._12_4_ = fStack_b54 * auVar287._12_4_;
                uVar103 = auVar265._0_4_;
                auVar206._4_4_ = uVar103;
                auVar206._0_4_ = uVar103;
                auVar206._8_4_ = uVar103;
                auVar206._12_4_ = uVar103;
                auVar287 = vfmadd213ps_fma(auVar206,auVar1,auVar188);
                auVar157._0_4_ = auVar225._0_4_;
                auVar157._4_4_ = auVar157._0_4_;
                auVar157._8_4_ = auVar157._0_4_;
                auVar157._12_4_ = auVar157._0_4_;
                auVar287 = vfmadd213ps_fma(auVar157,auVar5,auVar287);
                auVar273 = vfmadd231ps_fma(auVar287,auVar4,auVar107);
                auVar225 = vdpps_avx(auVar271,auVar271,0x7f);
                auVar287 = vblendps_avx(auVar225,_DAT_01f7aa10,0xe);
                auVar265 = vrsqrtss_avx(auVar287,auVar287);
                fVar204 = auVar265._0_4_;
                fVar218 = auVar225._0_4_;
                fVar204 = fVar204 * 1.5 + fVar218 * -0.5 * fVar204 * fVar204 * fVar204;
                auVar265 = vdpps_avx(auVar271,auVar273,0x7f);
                auVar158._0_4_ = auVar273._0_4_ * fVar218;
                auVar158._4_4_ = auVar273._4_4_ * fVar218;
                auVar158._8_4_ = auVar273._8_4_ * fVar218;
                auVar158._12_4_ = auVar273._12_4_ * fVar218;
                fVar222 = auVar265._0_4_;
                auVar227._0_4_ = auVar271._0_4_ * fVar222;
                auVar227._4_4_ = auVar271._4_4_ * fVar222;
                fVar217 = auVar271._8_4_;
                auVar227._8_4_ = fVar217 * fVar222;
                fVar253 = auVar271._12_4_;
                auVar227._12_4_ = fVar253 * fVar222;
                auVar265 = vsubps_avx(auVar158,auVar227);
                auVar287 = vrcpss_avx(auVar287,auVar287);
                auVar273 = vfnmadd213ss_fma(auVar287,auVar225,ZEXT416(0x40000000));
                fVar222 = auVar287._0_4_ * auVar273._0_4_;
                auVar287 = vmaxss_avx(ZEXT416((uint)local_960._0_4_),
                                      ZEXT416((uint)(fVar219 * (float)local_9e0._0_4_)));
                auVar277 = ZEXT1664(auVar287);
                local_9c0._0_8_ = auVar271._0_8_ ^ 0x8000000080000000;
                local_9c0._8_4_ = -fVar217;
                local_9c0._12_4_ = -fVar253;
                auVar189._0_4_ = fVar204 * auVar265._0_4_ * fVar222;
                auVar189._4_4_ = fVar204 * auVar265._4_4_ * fVar222;
                auVar189._8_4_ = fVar204 * auVar265._8_4_ * fVar222;
                auVar189._12_4_ = fVar204 * auVar265._12_4_ * fVar222;
                auVar235._0_4_ = auVar271._0_4_ * fVar204;
                auVar235._4_4_ = auVar271._4_4_ * fVar204;
                auVar235._8_4_ = fVar217 * fVar204;
                auVar235._12_4_ = fVar253 * fVar204;
                if (fVar218 < -fVar218) {
                  local_a20._0_4_ = auVar106._0_4_;
                  local_a00._0_16_ = auVar235;
                  local_940._0_16_ = auVar189;
                  fVar204 = sqrtf(fVar218);
                  auVar277 = ZEXT464(auVar287._0_4_);
                  auVar106 = ZEXT416((uint)local_a20._0_4_);
                  auVar189 = local_940._0_16_;
                  auVar235 = local_a00._0_16_;
                }
                else {
                  auVar225 = vsqrtss_avx(auVar225,auVar225);
                  fVar204 = auVar225._0_4_;
                }
                auVar225 = vdpps_avx(auVar112,auVar235,0x7f);
                auVar185 = vfmadd213ss_fma(ZEXT416((uint)local_960._0_4_),auVar106,auVar277._0_16_);
                auVar265 = vdpps_avx(local_9c0._0_16_,auVar235,0x7f);
                auVar273 = vdpps_avx(auVar112,auVar189,0x7f);
                local_a20._0_16_ = vdpps_avx(local_990,auVar235,0x7f);
                auVar185 = vfmadd213ss_fma(ZEXT416((uint)(auVar106._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_960._0_4_ / fVar204)),
                                           auVar185);
                auVar272 = ZEXT1664(auVar185);
                fVar204 = auVar265._0_4_ + auVar273._0_4_;
                auVar108._0_4_ = auVar225._0_4_ * auVar225._0_4_;
                auVar108._4_4_ = auVar225._4_4_ * auVar225._4_4_;
                auVar108._8_4_ = auVar225._8_4_ * auVar225._8_4_;
                auVar108._12_4_ = auVar225._12_4_ * auVar225._12_4_;
                auVar106 = vdpps_avx(auVar112,local_9c0._0_16_,0x7f);
                auVar273 = vsubps_avx(auVar110,auVar108);
                auVar265 = vrsqrtss_avx(auVar273,auVar273);
                fVar222 = auVar273._0_4_;
                fVar219 = auVar265._0_4_;
                fVar219 = fVar219 * 1.5 + fVar222 * -0.5 * fVar219 * fVar219 * fVar219;
                auVar265 = vdpps_avx(auVar112,local_990,0x7f);
                local_9c0._0_16_ = vfnmadd231ss_fma(auVar106,auVar225,ZEXT416((uint)fVar204));
                auVar106 = vfnmadd231ss_fma(auVar265,auVar225,local_a20._0_16_);
                if (fVar222 < 0.0) {
                  local_a00._0_16_ = auVar225;
                  local_940._0_4_ = auVar185._0_4_;
                  local_7a0._0_16_ = ZEXT416((uint)fVar204);
                  local_7c0._0_4_ = fVar219;
                  local_7e0._0_16_ = auVar106;
                  fVar222 = sqrtf(fVar222);
                  auVar272 = ZEXT464((uint)local_940._0_4_);
                  auVar277 = ZEXT464(auVar287._0_4_);
                  fVar219 = (float)local_7c0._0_4_;
                  auVar106 = local_7e0._0_16_;
                  auVar225 = local_a00._0_16_;
                  auVar287 = local_7a0._0_16_;
                }
                else {
                  auVar287 = vsqrtss_avx(auVar273,auVar273);
                  fVar222 = auVar287._0_4_;
                  auVar287 = ZEXT416((uint)fVar204);
                }
                auVar268 = ZEXT1664(auVar271);
                auVar265 = vpermilps_avx(local_780._0_16_,0xff);
                fVar222 = fVar222 - auVar265._0_4_;
                auVar265 = vshufps_avx(auVar271,auVar271,0xff);
                auVar273 = vfmsub213ss_fma(local_9c0._0_16_,ZEXT416((uint)fVar219),auVar265);
                auVar190._0_8_ = local_a20._0_8_ ^ 0x8000000080000000;
                auVar190._8_4_ = local_a20._8_4_ ^ 0x80000000;
                auVar190._12_4_ = local_a20._12_4_ ^ 0x80000000;
                auVar207._0_8_ = auVar273._0_8_ ^ 0x8000000080000000;
                auVar207._8_4_ = auVar273._8_4_ ^ 0x80000000;
                auVar207._12_4_ = auVar273._12_4_ ^ 0x80000000;
                auVar106 = ZEXT416((uint)(auVar106._0_4_ * fVar219));
                auVar273 = vfmsub231ss_fma(ZEXT416((uint)(auVar273._0_4_ * local_a20._0_4_)),
                                           auVar287,auVar106);
                auVar106 = vinsertps_avx(auVar207,auVar106,0x1c);
                uVar103 = auVar273._0_4_;
                auVar208._4_4_ = uVar103;
                auVar208._0_4_ = uVar103;
                auVar208._8_4_ = uVar103;
                auVar208._12_4_ = uVar103;
                auVar106 = vdivps_avx(auVar106,auVar208);
                auVar287 = vinsertps_avx(auVar287,auVar190,0x10);
                auVar287 = vdivps_avx(auVar287,auVar208);
                fVar204 = auVar225._0_4_;
                auVar159._0_4_ = fVar204 * auVar106._0_4_ + fVar222 * auVar287._0_4_;
                auVar159._4_4_ = fVar204 * auVar106._4_4_ + fVar222 * auVar287._4_4_;
                auVar159._8_4_ = fVar204 * auVar106._8_4_ + fVar222 * auVar287._8_4_;
                auVar159._12_4_ = fVar204 * auVar106._12_4_ + fVar222 * auVar287._12_4_;
                auVar106 = vsubps_avx(auVar166,auVar159);
                auVar258 = ZEXT1664(auVar106);
                auVar287 = vandps_avx(auVar225,local_a40._0_16_);
                fVar204 = (float)local_980._0_4_;
                fVar219 = (float)local_980._4_4_;
                fVar218 = fStack_978;
                fVar217 = fStack_974;
                fVar253 = fStack_970;
                fVar221 = fStack_96c;
                fVar220 = fStack_968;
                if (auVar287._0_4_ < auVar272._0_4_) {
                  auVar225 = vfmadd231ss_fma(ZEXT416((uint)(auVar277._0_4_ + auVar272._0_4_)),auVar3
                                             ,ZEXT416(0x36000000));
                  auVar287 = vandps_avx(ZEXT416((uint)fVar222),local_a40._0_16_);
                  if (auVar287._0_4_ < auVar225._0_4_) {
                    fVar222 = auVar106._0_4_ + (float)local_8d0._0_4_;
                    if (fVar222 < fVar102) {
                      bVar101 = 0;
                    }
                    else {
                      fVar270 = *(float *)(ray + k * 4 + 0x80);
                      auVar272 = ZEXT464((uint)fVar270);
                      if (fVar270 < fVar222) {
                        bVar101 = 0;
                      }
                      else {
                        auVar287 = vmovshdup_avx(auVar106);
                        bVar101 = 0;
                        if ((0.0 <= auVar287._0_4_) && (auVar287._0_4_ <= 1.0)) {
                          auVar110 = vrsqrtss_avx(auVar110,auVar110);
                          fVar224 = auVar110._0_4_;
                          pGVar7 = (context->scene->geometries).items[uVar92].ptr;
                          if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                            bVar101 = 0;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar101 = 1, pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)
                                  ) {
                            fVar216 = fVar224 * 1.5 + fVar216 * -0.5 * fVar224 * fVar224 * fVar224;
                            local_ae0 = auVar112._0_4_;
                            fStack_adc = auVar112._4_4_;
                            fStack_ad8 = auVar112._8_4_;
                            fStack_ad4 = auVar112._12_4_;
                            auVar160._0_4_ = fVar216 * local_ae0;
                            auVar160._4_4_ = fVar216 * fStack_adc;
                            auVar160._8_4_ = fVar216 * fStack_ad8;
                            auVar160._12_4_ = fVar216 * fStack_ad4;
                            auVar225 = vfmadd213ps_fma(auVar265,auVar160,auVar271);
                            auVar110 = vshufps_avx(auVar160,auVar160,0xc9);
                            auVar287 = vshufps_avx(auVar271,auVar271,0xc9);
                            auVar161._0_4_ = auVar160._0_4_ * auVar287._0_4_;
                            auVar161._4_4_ = auVar160._4_4_ * auVar287._4_4_;
                            auVar161._8_4_ = auVar160._8_4_ * auVar287._8_4_;
                            auVar161._12_4_ = auVar160._12_4_ * auVar287._12_4_;
                            auVar112 = vfmsub231ps_fma(auVar161,auVar271,auVar110);
                            auVar110 = vshufps_avx(auVar112,auVar112,0xc9);
                            auVar287 = vshufps_avx(auVar225,auVar225,0xc9);
                            auVar112 = vshufps_avx(auVar112,auVar112,0xd2);
                            auVar109._0_4_ = auVar225._0_4_ * auVar112._0_4_;
                            auVar109._4_4_ = auVar225._4_4_ * auVar112._4_4_;
                            auVar109._8_4_ = auVar225._8_4_ * auVar112._8_4_;
                            auVar109._12_4_ = auVar225._12_4_ * auVar112._12_4_;
                            auVar110 = vfmsub231ps_fma(auVar109,auVar110,auVar287);
                            local_710 = vshufps_avx(auVar106,auVar106,0x55);
                            local_740 = (RTCHitN  [16])vshufps_avx(auVar110,auVar110,0x55);
                            auStack_730 = vshufps_avx(auVar110,auVar110,0xaa);
                            local_720 = auVar110._0_4_;
                            local_700 = ZEXT416(0) << 0x20;
                            local_6f0 = CONCAT44(uStack_75c,local_760);
                            uStack_6e8 = CONCAT44(uStack_754,uStack_758);
                            local_6e0._4_4_ = uStack_74c;
                            local_6e0._0_4_ = local_750;
                            local_6e0._8_4_ = uStack_748;
                            local_6e0._12_4_ = uStack_744;
                            vpcmpeqd_avx2(ZEXT1632(local_6e0),ZEXT1632(local_6e0));
                            uStack_6cc = context->user->instID[0];
                            local_6d0 = uStack_6cc;
                            uStack_6c8 = uStack_6cc;
                            uStack_6c4 = uStack_6cc;
                            uStack_6c0 = context->user->instPrimID[0];
                            uStack_6bc = uStack_6c0;
                            uStack_6b8 = uStack_6c0;
                            uStack_6b4 = uStack_6c0;
                            *(float *)(ray + k * 4 + 0x80) = fVar222;
                            auVar110 = *(undefined1 (*) [16])
                                        (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
                            local_900._0_16_ = auVar110;
                            local_ab0.valid = (int *)local_900;
                            local_ab0.geometryUserPtr = pGVar7->userPtr;
                            local_ab0.context = context->user;
                            local_ab0.hit = local_740;
                            local_ab0.N = 4;
                            local_ab0.ray = (RTCRayN *)ray;
                            uStack_71c = local_720;
                            uStack_718 = local_720;
                            uStack_714 = local_720;
                            if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar258 = ZEXT1664(auVar106);
                              auVar268 = ZEXT1664(auVar271);
                              auVar277 = ZEXT1664(auVar277._0_16_);
                              (*pGVar7->occlusionFilterN)(&local_ab0);
                              auVar110 = local_900._0_16_;
                              fVar204 = (float)local_980._0_4_;
                              fVar219 = (float)local_980._4_4_;
                              fVar218 = fStack_978;
                              fVar217 = fStack_974;
                              fVar253 = fStack_970;
                              fVar221 = fStack_96c;
                              fVar220 = fStack_968;
                            }
                            if (auVar110 == (undefined1  [16])0x0) {
                              auVar110 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar110 = auVar110 ^ _DAT_01f7ae20;
                            }
                            else {
                              p_Var8 = context->args->filter;
                              if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar258 = ZEXT1664(auVar258._0_16_);
                                auVar268 = ZEXT1664(auVar268._0_16_);
                                auVar277 = ZEXT1664(auVar277._0_16_);
                                (*p_Var8)(&local_ab0);
                                auVar110 = local_900._0_16_;
                                fVar204 = (float)local_980._0_4_;
                                fVar219 = (float)local_980._4_4_;
                                fVar218 = fStack_978;
                                fVar217 = fStack_974;
                                fVar253 = fStack_970;
                                fVar221 = fStack_96c;
                                fVar220 = fStack_968;
                              }
                              auVar287 = vpcmpeqd_avx(auVar110,_DAT_01f7aa10);
                              auVar110 = auVar287 ^ _DAT_01f7ae20;
                              auVar162._8_4_ = 0xff800000;
                              auVar162._0_8_ = 0xff800000ff800000;
                              auVar162._12_4_ = 0xff800000;
                              auVar287 = vblendvps_avx(auVar162,*(undefined1 (*) [16])
                                                                 (local_ab0.ray + 0x80),auVar287);
                              *(undefined1 (*) [16])(local_ab0.ray + 0x80) = auVar287;
                            }
                            auVar272 = ZEXT464((uint)fVar270);
                            auVar139._8_8_ = 0x100000001;
                            auVar139._0_8_ = 0x100000001;
                            bVar101 = (auVar139 & auVar110) != (undefined1  [16])0x0;
                            if (!(bool)bVar101) {
                              *(float *)(ray + k * 4 + 0x80) = fVar270;
                            }
                          }
                        }
                      }
                    }
                    goto LAB_0182bec9;
                  }
                }
                bVar100 = uVar98 < 4;
                uVar98 = uVar98 + 1;
              } while (uVar98 != 5);
              bVar100 = false;
              bVar101 = 5;
LAB_0182bec9:
              bVar99 = (bool)(bVar99 | bVar100 & bVar101);
              uVar103 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar123._4_4_ = uVar103;
              auVar123._0_4_ = uVar103;
              auVar123._8_4_ = uVar103;
              auVar123._12_4_ = uVar103;
              auVar123._16_4_ = uVar103;
              auVar123._20_4_ = uVar103;
              auVar123._24_4_ = uVar103;
              auVar123._28_4_ = uVar103;
              auVar150 = vcmpps_avx(_local_820,auVar123,2);
              auVar117 = vandps_avx(auVar150,local_5a0);
              auVar180 = ZEXT3264(auVar117);
              auVar150 = local_5a0 & auVar150;
              local_5a0 = auVar117;
            } while ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar150 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar150 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar150 >> 0x7f,0) != '\0') ||
                       (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar150 >> 0xbf,0) != '\0') ||
                     (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar150[0x1f] < '\0');
            auVar180 = ZEXT3264(local_3a0);
            auVar241 = ZEXT3264(local_a60);
            auVar117 = local_620;
          }
          auVar14 = local_3a0;
          auVar154._0_4_ = fVar204 * (float)local_680._0_4_;
          auVar154._4_4_ = fVar219 * (float)local_680._4_4_;
          auVar154._8_4_ = fVar218 * fStack_678;
          auVar154._12_4_ = fVar217 * fStack_674;
          auVar154._16_4_ = fVar253 * fStack_670;
          auVar154._20_4_ = fVar221 * fStack_66c;
          auVar154._28_36_ = auVar180._28_36_;
          auVar154._24_4_ = fVar220 * fStack_668;
          auVar3 = vfmadd213ps_fma(local_8a0,_local_a80,auVar154._0_32_);
          auVar3 = vfmadd213ps_fma(local_880,_local_800,ZEXT1632(auVar3));
          auVar150 = vandps_avx(ZEXT1632(auVar3),local_860);
          auVar176._8_4_ = 0x3e99999a;
          auVar176._0_8_ = 0x3e99999a3e99999a;
          auVar176._12_4_ = 0x3e99999a;
          auVar176._16_4_ = 0x3e99999a;
          auVar176._20_4_ = 0x3e99999a;
          auVar176._24_4_ = 0x3e99999a;
          auVar176._28_4_ = 0x3e99999a;
          auVar150 = vcmpps_avx(auVar150,auVar176,1);
          auVar13 = vorps_avx(auVar150,local_5e0);
          auVar177._0_4_ = (float)local_920._0_4_ + auVar241._0_4_;
          auVar177._4_4_ = (float)local_920._4_4_ + auVar241._4_4_;
          auVar177._8_4_ = fStack_918 + auVar241._8_4_;
          auVar177._12_4_ = fStack_914 + auVar241._12_4_;
          auVar177._16_4_ = fStack_910 + auVar241._16_4_;
          auVar177._20_4_ = fStack_90c + auVar241._20_4_;
          auVar177._24_4_ = fStack_908 + auVar241._24_4_;
          auVar177._28_4_ = fStack_904 + auVar241._28_4_;
          auVar150 = vcmpps_avx(auVar177,auVar123,2);
          local_880 = vandps_avx(auVar117,auVar150);
          auVar178._8_4_ = 3;
          auVar178._0_8_ = 0x300000003;
          auVar178._12_4_ = 3;
          auVar178._16_4_ = 3;
          auVar178._20_4_ = 3;
          auVar178._24_4_ = 3;
          auVar178._28_4_ = 3;
          auVar202._8_4_ = 2;
          auVar202._0_8_ = 0x200000002;
          auVar202._12_4_ = 2;
          auVar202._16_4_ = 2;
          auVar202._20_4_ = 2;
          auVar202._24_4_ = 2;
          auVar202._28_4_ = 2;
          auVar117 = vblendvps_avx(auVar202,auVar178,auVar13);
          local_8a0 = vpcmpgtd_avx2(auVar117,local_600);
          auVar117 = vpandn_avx2(local_8a0,local_880);
          auVar150 = local_880 & ~local_8a0;
          local_900 = auVar117;
          if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar150 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar150 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar150 >> 0x7f,0) != '\0') ||
                (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar150 >> 0xbf,0) != '\0') ||
              (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar150[0x1f] < '\0') {
            auVar110 = vminps_avx(auVar4,auVar5);
            auVar3 = vmaxps_avx(auVar4,auVar5);
            auVar287 = vminps_avx(auVar1,auVar2);
            auVar112 = vminps_avx(auVar110,auVar287);
            auVar110 = vmaxps_avx(auVar1,auVar2);
            auVar287 = vmaxps_avx(auVar3,auVar110);
            local_a20._8_4_ = 0x7fffffff;
            local_a20._0_8_ = 0x7fffffff7fffffff;
            local_a20._12_4_ = 0x7fffffff;
            auVar3 = vandps_avx(auVar112,local_a20._0_16_);
            auVar110 = vandps_avx(auVar287,local_a20._0_16_);
            auVar3 = vmaxps_avx(auVar3,auVar110);
            auVar110 = vmovshdup_avx(auVar3);
            auVar110 = vmaxss_avx(auVar110,auVar3);
            auVar3 = vshufpd_avx(auVar3,auVar3,1);
            auVar3 = vmaxss_avx(auVar3,auVar110);
            local_960._0_4_ = auVar3._0_4_ * 1.9073486e-06;
            local_7e0._0_16_ = vshufps_avx(auVar287,auVar287,0xff);
            local_820._4_4_ = (float)local_920._4_4_ + local_3a0._4_4_;
            local_820._0_4_ = (float)local_920._0_4_ + local_3a0._0_4_;
            fStack_818 = fStack_918 + local_3a0._8_4_;
            fStack_814 = fStack_914 + local_3a0._12_4_;
            fStack_810 = fStack_910 + local_3a0._16_4_;
            fStack_80c = fStack_90c + local_3a0._20_4_;
            fStack_808 = fStack_908 + local_3a0._24_4_;
            fStack_804 = fStack_904 + local_3a0._28_4_;
            do {
              auVar125._8_4_ = 0x7f800000;
              auVar125._0_8_ = 0x7f8000007f800000;
              auVar125._12_4_ = 0x7f800000;
              auVar125._16_4_ = 0x7f800000;
              auVar125._20_4_ = 0x7f800000;
              auVar125._24_4_ = 0x7f800000;
              auVar125._28_4_ = 0x7f800000;
              auVar150 = vblendvps_avx(auVar125,auVar14,auVar117);
              auVar13 = vshufps_avx(auVar150,auVar150,0xb1);
              auVar13 = vminps_avx(auVar150,auVar13);
              auVar15 = vshufpd_avx(auVar13,auVar13,5);
              auVar13 = vminps_avx(auVar13,auVar15);
              auVar15 = vpermpd_avx2(auVar13,0x4e);
              auVar13 = vminps_avx(auVar13,auVar15);
              auVar13 = vcmpps_avx(auVar150,auVar13,0);
              auVar15 = auVar117 & auVar13;
              auVar150 = auVar117;
              if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar15 >> 0x7f,0) != '\0') ||
                    (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar15 >> 0xbf,0) != '\0') ||
                  (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar15[0x1f] < '\0') {
                auVar150 = vandps_avx(auVar13,auVar117);
              }
              uVar94 = vmovmskps_avx(auVar150);
              iVar17 = 0;
              for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
                iVar17 = iVar17 + 1;
              }
              uVar95 = iVar17 << 2;
              local_900 = auVar117;
              *(undefined4 *)(local_900 + uVar95) = 0;
              uVar94 = *(uint *)(local_1c0 + uVar95);
              uVar95 = *(uint *)(local_380 + uVar95);
              fVar204 = auVar10._0_4_;
              if ((float)local_9a0._0_4_ < 0.0) {
                fVar204 = sqrtf((float)local_9a0._0_4_);
              }
              local_9c0._0_4_ = fVar204 * 1.9073486e-06;
              auVar3 = vinsertps_avx(ZEXT416(uVar95),ZEXT416(uVar94),0x10);
              auVar258 = ZEXT1664(auVar3);
              bVar100 = true;
              uVar98 = 0;
              do {
                auVar225 = auVar258._0_16_;
                auVar110 = vmovshdup_avx(auVar225);
                fVar216 = auVar110._0_4_;
                fVar217 = 1.0 - fVar216;
                fVar222 = fVar217 * fVar217 * fVar217;
                fVar218 = fVar216 * fVar216;
                fVar219 = fVar216 * fVar218;
                auVar287 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar222),
                                           ZEXT416((uint)fVar219));
                fVar204 = fVar216 * fVar217;
                auVar112 = vfmadd231ss_fma(ZEXT416((uint)(fVar216 * fVar204 * 6.0)),
                                           ZEXT416((uint)(fVar217 * fVar204)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar217 * fVar204 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar216 * fVar204)));
                auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar219),
                                         ZEXT416((uint)fVar222));
                fVar216 = (auVar3._0_4_ + auVar106._0_4_) * 0.16666667;
                fVar219 = fVar219 * 0.16666667;
                auVar140._0_4_ = fVar219 * fVar130;
                auVar140._4_4_ = fVar219 * fStack_b5c;
                auVar140._8_4_ = fVar219 * fStack_b58;
                auVar140._12_4_ = fVar219 * fStack_b54;
                auVar191._4_4_ = fVar216;
                auVar191._0_4_ = fVar216;
                auVar191._8_4_ = fVar216;
                auVar191._12_4_ = fVar216;
                auVar3 = vfmadd132ps_fma(auVar191,auVar140,auVar1);
                fVar216 = (auVar287._0_4_ + auVar112._0_4_) * 0.16666667;
                auVar141._4_4_ = fVar216;
                auVar141._0_4_ = fVar216;
                auVar141._8_4_ = fVar216;
                auVar141._12_4_ = fVar216;
                auVar3 = vfmadd132ps_fma(auVar141,auVar3,auVar5);
                fVar219 = auVar258._0_4_;
                auVar163._4_4_ = fVar219;
                auVar163._0_4_ = fVar219;
                auVar163._8_4_ = fVar219;
                auVar163._12_4_ = fVar219;
                auVar287 = vfmadd213ps_fma(auVar163,local_990,_DAT_01f7aa10);
                fVar222 = fVar222 * 0.16666667;
                auVar111._4_4_ = fVar222;
                auVar111._0_4_ = fVar222;
                auVar111._8_4_ = fVar222;
                auVar111._12_4_ = fVar222;
                auVar3 = vfmadd132ps_fma(auVar111,auVar3,auVar4);
                local_780._0_16_ = auVar3;
                auVar287 = vsubps_avx(auVar287,auVar3);
                auVar3 = vdpps_avx(auVar287,auVar287,0x7f);
                fVar216 = auVar3._0_4_;
                if (fVar216 < 0.0) {
                  local_a40._0_4_ = fVar218;
                  local_9e0._0_4_ = fVar204;
                  auVar272._0_4_ = sqrtf(fVar216);
                  auVar272._4_60_ = extraout_var_00;
                  auVar112 = auVar272._0_16_;
                  fVar218 = (float)local_a40._0_4_;
                  fVar204 = (float)local_9e0._0_4_;
                }
                else {
                  auVar112 = vsqrtss_avx(auVar3,auVar3);
                }
                auVar271 = ZEXT416((uint)fVar217);
                auVar113._4_4_ = fVar217;
                auVar113._0_4_ = fVar217;
                auVar113._8_4_ = fVar217;
                auVar113._12_4_ = fVar217;
                auVar166 = vfnmsub213ss_fma(auVar110,auVar110,ZEXT416((uint)(fVar204 * 4.0)));
                auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar204 * 4.0)),auVar271,auVar271);
                fVar204 = fVar217 * -fVar217 * 0.5;
                fVar222 = auVar166._0_4_ * 0.5;
                fVar217 = auVar106._0_4_ * 0.5;
                fVar218 = fVar218 * 0.5;
                auVar228._0_4_ = fVar130 * fVar218;
                auVar228._4_4_ = fStack_b5c * fVar218;
                auVar228._8_4_ = fStack_b58 * fVar218;
                auVar228._12_4_ = fStack_b54 * fVar218;
                auVar192._4_4_ = fVar217;
                auVar192._0_4_ = fVar217;
                auVar192._8_4_ = fVar217;
                auVar192._12_4_ = fVar217;
                auVar106 = vfmadd213ps_fma(auVar192,auVar1,auVar228);
                auVar209._4_4_ = fVar222;
                auVar209._0_4_ = fVar222;
                auVar209._8_4_ = fVar222;
                auVar209._12_4_ = fVar222;
                auVar106 = vfmadd213ps_fma(auVar209,auVar5,auVar106);
                auVar267._4_4_ = fVar204;
                auVar267._0_4_ = fVar204;
                auVar267._8_4_ = fVar204;
                auVar267._12_4_ = fVar204;
                auVar265 = vfmadd213ps_fma(auVar267,auVar4,auVar106);
                auVar106 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar271,auVar110);
                auVar166 = vfmadd213ss_fma(auVar110,SUB6416(ZEXT464(0xc0000000),0),auVar271);
                auVar110 = vshufps_avx(auVar225,auVar225,0x55);
                auVar193._0_4_ = fVar130 * auVar110._0_4_;
                auVar193._4_4_ = fStack_b5c * auVar110._4_4_;
                auVar193._8_4_ = fStack_b58 * auVar110._8_4_;
                auVar193._12_4_ = fStack_b54 * auVar110._12_4_;
                uVar103 = auVar166._0_4_;
                auVar210._4_4_ = uVar103;
                auVar210._0_4_ = uVar103;
                auVar210._8_4_ = uVar103;
                auVar210._12_4_ = uVar103;
                auVar110 = vfmadd213ps_fma(auVar210,auVar1,auVar193);
                auVar164._0_4_ = auVar106._0_4_;
                auVar164._4_4_ = auVar164._0_4_;
                auVar164._8_4_ = auVar164._0_4_;
                auVar164._12_4_ = auVar164._0_4_;
                auVar110 = vfmadd213ps_fma(auVar164,auVar5,auVar110);
                auVar271 = vfmadd231ps_fma(auVar110,auVar4,auVar113);
                auVar106 = vdpps_avx(auVar265,auVar265,0x7f);
                auVar110 = vblendps_avx(auVar106,_DAT_01f7aa10,0xe);
                auVar166 = vrsqrtss_avx(auVar110,auVar110);
                fVar204 = auVar166._0_4_;
                fVar218 = auVar106._0_4_;
                fVar204 = fVar204 * 1.5 + fVar218 * -0.5 * fVar204 * fVar204 * fVar204;
                auVar166 = vdpps_avx(auVar265,auVar271,0x7f);
                auVar165._0_4_ = auVar271._0_4_ * fVar218;
                auVar165._4_4_ = auVar271._4_4_ * fVar218;
                auVar165._8_4_ = auVar271._8_4_ * fVar218;
                auVar165._12_4_ = auVar271._12_4_ * fVar218;
                fVar222 = auVar166._0_4_;
                auVar229._0_4_ = auVar265._0_4_ * fVar222;
                auVar229._4_4_ = auVar265._4_4_ * fVar222;
                fVar217 = auVar265._8_4_;
                auVar229._8_4_ = fVar217 * fVar222;
                fVar253 = auVar265._12_4_;
                auVar229._12_4_ = fVar253 * fVar222;
                auVar166 = vsubps_avx(auVar165,auVar229);
                auVar110 = vrcpss_avx(auVar110,auVar110);
                auVar271 = vfnmadd213ss_fma(auVar110,auVar106,ZEXT416(0x40000000));
                fVar222 = auVar110._0_4_ * auVar271._0_4_;
                auVar110 = vmaxss_avx(ZEXT416((uint)local_960._0_4_),
                                      ZEXT416((uint)(fVar219 * (float)local_9c0._0_4_)));
                auVar180 = ZEXT1664(auVar110);
                auVar236._0_8_ = auVar265._0_8_ ^ 0x8000000080000000;
                auVar236._8_4_ = -fVar217;
                auVar236._12_4_ = -fVar253;
                auVar194._0_4_ = fVar204 * auVar166._0_4_ * fVar222;
                auVar194._4_4_ = fVar204 * auVar166._4_4_ * fVar222;
                auVar194._8_4_ = fVar204 * auVar166._8_4_ * fVar222;
                auVar194._12_4_ = fVar204 * auVar166._12_4_ * fVar222;
                auVar255._0_4_ = auVar265._0_4_ * fVar204;
                auVar255._4_4_ = auVar265._4_4_ * fVar204;
                auVar255._8_4_ = fVar217 * fVar204;
                auVar255._12_4_ = fVar253 * fVar204;
                if (fVar218 < -fVar218) {
                  local_a40._0_4_ = auVar112._0_4_;
                  local_9e0._0_16_ = auVar236;
                  local_a60._0_16_ = auVar255;
                  local_a00._0_16_ = auVar194;
                  fVar204 = sqrtf(fVar218);
                  auVar180 = ZEXT464(auVar110._0_4_);
                  auVar112 = ZEXT416((uint)local_a40._0_4_);
                  auVar194 = local_a00._0_16_;
                  auVar236 = local_9e0._0_16_;
                  auVar255 = local_a60._0_16_;
                }
                else {
                  auVar106 = vsqrtss_avx(auVar106,auVar106);
                  fVar204 = auVar106._0_4_;
                }
                auVar106 = vdpps_avx(auVar287,auVar255,0x7f);
                auVar185 = vfmadd213ss_fma(ZEXT416((uint)local_960._0_4_),auVar112,auVar180._0_16_);
                auVar166 = vdpps_avx(auVar236,auVar255,0x7f);
                auVar271 = vdpps_avx(auVar287,auVar194,0x7f);
                auVar273 = vdpps_avx(local_990,auVar255,0x7f);
                auVar185 = vfmadd213ss_fma(ZEXT416((uint)(auVar112._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_960._0_4_ / fVar204)),
                                           auVar185);
                auVar272 = ZEXT1664(auVar185);
                fVar204 = auVar166._0_4_ + auVar271._0_4_;
                auVar277 = ZEXT464((uint)fVar204);
                auVar114._0_4_ = auVar106._0_4_ * auVar106._0_4_;
                auVar114._4_4_ = auVar106._4_4_ * auVar106._4_4_;
                auVar114._8_4_ = auVar106._8_4_ * auVar106._8_4_;
                auVar114._12_4_ = auVar106._12_4_ * auVar106._12_4_;
                auVar112 = vdpps_avx(auVar287,auVar236,0x7f);
                auVar271 = vsubps_avx(auVar3,auVar114);
                auVar166 = vrsqrtss_avx(auVar271,auVar271);
                fVar222 = auVar271._0_4_;
                fVar219 = auVar166._0_4_;
                fVar219 = fVar219 * 1.5 + fVar222 * -0.5 * fVar219 * fVar219 * fVar219;
                auVar166 = vdpps_avx(auVar287,local_990,0x7f);
                auVar112 = vfnmadd231ss_fma(auVar112,auVar106,ZEXT416((uint)fVar204));
                auVar166 = vfnmadd231ss_fma(auVar166,auVar106,auVar273);
                if (fVar222 < 0.0) {
                  local_a40._0_16_ = auVar106;
                  local_9e0._0_4_ = auVar185._0_4_;
                  local_a60._0_16_ = ZEXT416((uint)fVar204);
                  local_a00._0_16_ = auVar273;
                  local_940._0_16_ = auVar112;
                  local_7a0._0_4_ = fVar219;
                  local_7c0._0_16_ = auVar166;
                  fVar204 = sqrtf(fVar222);
                  auVar277 = ZEXT1664(local_a60._0_16_);
                  auVar272 = ZEXT464((uint)local_9e0._0_4_);
                  auVar180 = ZEXT464(auVar110._0_4_);
                  fVar219 = (float)local_7a0._0_4_;
                  auVar166 = local_7c0._0_16_;
                  auVar106 = local_a40._0_16_;
                  auVar273 = local_a00._0_16_;
                  auVar112 = local_940._0_16_;
                }
                else {
                  auVar110 = vsqrtss_avx(auVar271,auVar271);
                  fVar204 = auVar110._0_4_;
                }
                auVar268 = ZEXT1664(auVar106);
                auVar241 = ZEXT1664(auVar265);
                auVar110 = vpermilps_avx(local_780._0_16_,0xff);
                fVar204 = fVar204 - auVar110._0_4_;
                auVar271 = vshufps_avx(auVar265,auVar265,0xff);
                auVar110 = vfmsub213ss_fma(auVar112,ZEXT416((uint)fVar219),auVar271);
                auVar195._0_8_ = auVar273._0_8_ ^ 0x8000000080000000;
                auVar195._8_4_ = auVar273._8_4_ ^ 0x80000000;
                auVar195._12_4_ = auVar273._12_4_ ^ 0x80000000;
                auVar211._0_8_ = auVar110._0_8_ ^ 0x8000000080000000;
                auVar211._8_4_ = auVar110._8_4_ ^ 0x80000000;
                auVar211._12_4_ = auVar110._12_4_ ^ 0x80000000;
                auVar166 = ZEXT416((uint)(auVar166._0_4_ * fVar219));
                auVar185 = auVar277._0_16_;
                auVar112 = vfmsub231ss_fma(ZEXT416((uint)(auVar273._0_4_ * auVar110._0_4_)),auVar185
                                           ,auVar166);
                auVar110 = vinsertps_avx(auVar211,auVar166,0x1c);
                uVar103 = auVar112._0_4_;
                auVar212._4_4_ = uVar103;
                auVar212._0_4_ = uVar103;
                auVar212._8_4_ = uVar103;
                auVar212._12_4_ = uVar103;
                auVar110 = vdivps_avx(auVar110,auVar212);
                auVar112 = vinsertps_avx(auVar185,auVar195,0x10);
                auVar112 = vdivps_avx(auVar112,auVar212);
                fVar219 = auVar106._0_4_;
                auVar167._0_4_ = fVar219 * auVar110._0_4_ + fVar204 * auVar112._0_4_;
                auVar167._4_4_ = fVar219 * auVar110._4_4_ + fVar204 * auVar112._4_4_;
                auVar167._8_4_ = fVar219 * auVar110._8_4_ + fVar204 * auVar112._8_4_;
                auVar167._12_4_ = fVar219 * auVar110._12_4_ + fVar204 * auVar112._12_4_;
                auVar112 = vsubps_avx(auVar225,auVar167);
                auVar258 = ZEXT1664(auVar112);
                auVar110 = vandps_avx(auVar106,local_a20._0_16_);
                if (auVar110._0_4_ < auVar272._0_4_) {
                  auVar225 = vfmadd231ss_fma(ZEXT416((uint)(auVar180._0_4_ + auVar272._0_4_)),
                                             local_7e0._0_16_,ZEXT416(0x36000000));
                  auVar110 = vandps_avx(ZEXT416((uint)fVar204),local_a20._0_16_);
                  if (auVar110._0_4_ < auVar225._0_4_) {
                    fVar204 = auVar112._0_4_ + (float)local_8d0._0_4_;
                    if (fVar204 < fVar102) {
                      bVar101 = 0;
                    }
                    else {
                      fVar219 = *(float *)(ray + k * 4 + 0x80);
                      if (fVar219 < fVar204) {
                        bVar101 = 0;
                      }
                      else {
                        auVar110 = vmovshdup_avx(auVar112);
                        bVar101 = 0;
                        if ((0.0 <= auVar110._0_4_) && (auVar110._0_4_ <= 1.0)) {
                          auVar3 = vrsqrtss_avx(auVar3,auVar3);
                          fVar222 = auVar3._0_4_;
                          pGVar7 = (context->scene->geometries).items[uVar92].ptr;
                          if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                            bVar101 = 0;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar101 = 1, pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)
                                  ) {
                            fVar216 = fVar222 * 1.5 + fVar216 * -0.5 * fVar222 * fVar222 * fVar222;
                            local_ae0 = auVar287._0_4_;
                            fStack_adc = auVar287._4_4_;
                            fStack_ad8 = auVar287._8_4_;
                            fStack_ad4 = auVar287._12_4_;
                            auVar168._0_4_ = fVar216 * local_ae0;
                            auVar168._4_4_ = fVar216 * fStack_adc;
                            auVar168._8_4_ = fVar216 * fStack_ad8;
                            auVar168._12_4_ = fVar216 * fStack_ad4;
                            auVar225 = vfmadd213ps_fma(auVar271,auVar168,auVar265);
                            auVar3 = vshufps_avx(auVar168,auVar168,0xc9);
                            auVar110 = vshufps_avx(auVar265,auVar265,0xc9);
                            auVar169._0_4_ = auVar168._0_4_ * auVar110._0_4_;
                            auVar169._4_4_ = auVar168._4_4_ * auVar110._4_4_;
                            auVar169._8_4_ = auVar168._8_4_ * auVar110._8_4_;
                            auVar169._12_4_ = auVar168._12_4_ * auVar110._12_4_;
                            auVar287 = vfmsub231ps_fma(auVar169,auVar265,auVar3);
                            auVar3 = vshufps_avx(auVar287,auVar287,0xc9);
                            auVar110 = vshufps_avx(auVar225,auVar225,0xc9);
                            auVar287 = vshufps_avx(auVar287,auVar287,0xd2);
                            auVar115._0_4_ = auVar225._0_4_ * auVar287._0_4_;
                            auVar115._4_4_ = auVar225._4_4_ * auVar287._4_4_;
                            auVar115._8_4_ = auVar225._8_4_ * auVar287._8_4_;
                            auVar115._12_4_ = auVar225._12_4_ * auVar287._12_4_;
                            auVar3 = vfmsub231ps_fma(auVar115,auVar3,auVar110);
                            local_710 = vshufps_avx(auVar112,auVar112,0x55);
                            local_740 = (RTCHitN  [16])vshufps_avx(auVar3,auVar3,0x55);
                            auStack_730 = vshufps_avx(auVar3,auVar3,0xaa);
                            local_720 = auVar3._0_4_;
                            local_700 = ZEXT416(0) << 0x20;
                            local_6f0 = CONCAT44(uStack_75c,local_760);
                            uStack_6e8 = CONCAT44(uStack_754,uStack_758);
                            local_6e0._4_4_ = uStack_74c;
                            local_6e0._0_4_ = local_750;
                            local_6e0._8_4_ = uStack_748;
                            local_6e0._12_4_ = uStack_744;
                            vpcmpeqd_avx2(ZEXT1632(local_6e0),ZEXT1632(local_6e0));
                            uStack_6cc = context->user->instID[0];
                            local_6d0 = uStack_6cc;
                            uStack_6c8 = uStack_6cc;
                            uStack_6c4 = uStack_6cc;
                            uStack_6c0 = context->user->instPrimID[0];
                            uStack_6bc = uStack_6c0;
                            uStack_6b8 = uStack_6c0;
                            uStack_6b4 = uStack_6c0;
                            *(float *)(ray + k * 4 + 0x80) = fVar204;
                            local_8c0 = *(undefined1 (*) [16])
                                         (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
                            local_ab0.valid = (int *)local_8c0;
                            local_ab0.geometryUserPtr = pGVar7->userPtr;
                            local_ab0.context = context->user;
                            local_ab0.hit = local_740;
                            local_ab0.N = 4;
                            local_ab0.ray = (RTCRayN *)ray;
                            uStack_71c = local_720;
                            uStack_718 = local_720;
                            uStack_714 = local_720;
                            if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar241 = ZEXT1664(auVar265);
                              auVar258 = ZEXT1664(auVar112);
                              auVar268 = ZEXT1664(auVar106);
                              auVar272 = ZEXT1664(auVar272._0_16_);
                              auVar277 = ZEXT1664(auVar185);
                              (*pGVar7->occlusionFilterN)(&local_ab0);
                            }
                            if (local_8c0 == (undefined1  [16])0x0) {
                              auVar3 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar3 = auVar3 ^ _DAT_01f7ae20;
                            }
                            else {
                              p_Var8 = context->args->filter;
                              if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar241 = ZEXT1664(auVar241._0_16_);
                                auVar258 = ZEXT1664(auVar258._0_16_);
                                auVar268 = ZEXT1664(auVar268._0_16_);
                                auVar272 = ZEXT1664(auVar272._0_16_);
                                auVar277 = ZEXT1664(auVar277._0_16_);
                                (*p_Var8)(&local_ab0);
                              }
                              auVar110 = vpcmpeqd_avx(local_8c0,_DAT_01f7aa10);
                              auVar3 = auVar110 ^ _DAT_01f7ae20;
                              auVar170._8_4_ = 0xff800000;
                              auVar170._0_8_ = 0xff800000ff800000;
                              auVar170._12_4_ = 0xff800000;
                              auVar110 = vblendvps_avx(auVar170,*(undefined1 (*) [16])
                                                                 (local_ab0.ray + 0x80),auVar110);
                              *(undefined1 (*) [16])(local_ab0.ray + 0x80) = auVar110;
                            }
                            auVar142._8_8_ = 0x100000001;
                            auVar142._0_8_ = 0x100000001;
                            bVar101 = (auVar142 & auVar3) != (undefined1  [16])0x0;
                            if (!(bool)bVar101) {
                              *(float *)(ray + k * 4 + 0x80) = fVar219;
                            }
                          }
                        }
                      }
                    }
                    goto LAB_0182c9c9;
                  }
                }
                bVar100 = uVar98 < 4;
                uVar98 = uVar98 + 1;
              } while (uVar98 != 5);
              bVar100 = false;
              bVar101 = 5;
LAB_0182c9c9:
              bVar99 = (bool)(bVar99 | bVar100 & bVar101);
              uVar103 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar123._4_4_ = uVar103;
              auVar123._0_4_ = uVar103;
              auVar123._8_4_ = uVar103;
              auVar123._12_4_ = uVar103;
              auVar123._16_4_ = uVar103;
              auVar123._20_4_ = uVar103;
              auVar123._24_4_ = uVar103;
              auVar123._28_4_ = uVar103;
              auVar150 = vcmpps_avx(_local_820,auVar123,2);
              auVar117 = vandps_avx(auVar150,local_900);
              auVar150 = local_900 & auVar150;
              local_900 = auVar117;
            } while ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar150 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar150 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar150 >> 0x7f,0) != '\0') ||
                       (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar150 >> 0xbf,0) != '\0') ||
                     (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar150[0x1f] < '\0');
          }
          auVar179._0_4_ = (float)local_920._0_4_ + local_3e0._0_4_;
          auVar179._4_4_ = (float)local_920._4_4_ + local_3e0._4_4_;
          auVar179._8_4_ = fStack_918 + local_3e0._8_4_;
          auVar179._12_4_ = fStack_914 + local_3e0._12_4_;
          auVar179._16_4_ = fStack_910 + local_3e0._16_4_;
          auVar179._20_4_ = fStack_90c + local_3e0._20_4_;
          auVar179._24_4_ = fStack_908 + local_3e0._24_4_;
          auVar179._28_4_ = fStack_904 + local_3e0._28_4_;
          auVar150 = vcmpps_avx(auVar179,auVar123,2);
          auVar117 = vandps_avx(local_5c0,local_6a0);
          auVar117 = vandps_avx(auVar150,auVar117);
          auVar203._0_4_ = (float)local_920._0_4_ + local_3a0._0_4_;
          auVar203._4_4_ = (float)local_920._4_4_ + local_3a0._4_4_;
          auVar203._8_4_ = fStack_918 + local_3a0._8_4_;
          auVar203._12_4_ = fStack_914 + local_3a0._12_4_;
          auVar203._16_4_ = fStack_910 + local_3a0._16_4_;
          auVar203._20_4_ = fStack_90c + local_3a0._20_4_;
          auVar203._24_4_ = fStack_908 + local_3a0._24_4_;
          auVar203._28_4_ = fStack_904 + local_3a0._28_4_;
          auVar13 = vcmpps_avx(auVar203,auVar123,2);
          auVar150 = vandps_avx(local_8a0,local_880);
          auVar150 = vandps_avx(auVar13,auVar150);
          auVar150 = vorps_avx(auVar117,auVar150);
          if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar150 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar150 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar150 >> 0x7f,0) != '\0') ||
                (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar150 >> 0xbf,0) != '\0') ||
              (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar150[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar97 * 0x60) = auVar150;
            auVar117 = vblendvps_avx(local_3a0,local_3e0,auVar117);
            *(undefined1 (*) [32])(auStack_160 + uVar97 * 0x60) = auVar117;
            uVar234 = vmovlps_avx(local_570);
            (&uStack_140)[uVar97 * 0xc] = uVar234;
            aiStack_138[uVar97 * 0x18] = local_be8 + 1;
            iVar96 = iVar96 + 1;
          }
        }
      }
    }
    if (iVar96 == 0) break;
    uVar103 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar126._4_4_ = uVar103;
    auVar126._0_4_ = uVar103;
    auVar126._8_4_ = uVar103;
    auVar126._12_4_ = uVar103;
    auVar126._16_4_ = uVar103;
    auVar126._20_4_ = uVar103;
    auVar126._24_4_ = uVar103;
    auVar126._28_4_ = uVar103;
    uVar94 = -iVar96;
    pauVar93 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar96 - 1) * 0x60);
    fVar204 = (float)local_920._0_4_;
    fVar216 = (float)local_920._4_4_;
    fVar219 = fStack_918;
    fVar222 = fStack_914;
    fVar218 = fStack_910;
    fVar217 = fStack_90c;
    fVar253 = fStack_908;
    fVar221 = fStack_904;
    while( true ) {
      auVar117 = pauVar93[1];
      auVar151._0_4_ = fVar204 + auVar117._0_4_;
      auVar151._4_4_ = fVar216 + auVar117._4_4_;
      auVar151._8_4_ = fVar219 + auVar117._8_4_;
      auVar151._12_4_ = fVar222 + auVar117._12_4_;
      auVar151._16_4_ = fVar218 + auVar117._16_4_;
      auVar151._20_4_ = fVar217 + auVar117._20_4_;
      auVar151._24_4_ = fVar253 + auVar117._24_4_;
      auVar151._28_4_ = fVar221 + auVar117._28_4_;
      auVar150 = vcmpps_avx(auVar151,auVar126,2);
      _local_740 = vandps_avx(auVar150,*pauVar93);
      auVar150 = *pauVar93 & auVar150;
      if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar150 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar150 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar150 >> 0x7f,0) != '\0') ||
            (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar150 >> 0xbf,0) != '\0') ||
          (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar150[0x1f] < '\0') break;
      pauVar93 = pauVar93 + -3;
      uVar94 = uVar94 + 1;
      fVar204 = (float)local_920._0_4_;
      fVar216 = (float)local_920._4_4_;
      fVar219 = fStack_918;
      fVar222 = fStack_914;
      fVar218 = fStack_910;
      fVar217 = fStack_90c;
      fVar253 = fStack_908;
      fVar221 = fStack_904;
      if (uVar94 == 0) goto LAB_0182cfb4;
    }
    auVar127._8_4_ = 0x7f800000;
    auVar127._0_8_ = 0x7f8000007f800000;
    auVar127._12_4_ = 0x7f800000;
    auVar127._16_4_ = 0x7f800000;
    auVar127._20_4_ = 0x7f800000;
    auVar127._24_4_ = 0x7f800000;
    auVar127._28_4_ = 0x7f800000;
    auVar117 = vblendvps_avx(auVar127,auVar117,_local_740);
    auVar150 = vshufps_avx(auVar117,auVar117,0xb1);
    auVar150 = vminps_avx(auVar117,auVar150);
    auVar13 = vshufpd_avx(auVar150,auVar150,5);
    auVar150 = vminps_avx(auVar150,auVar13);
    auVar13 = vpermpd_avx2(auVar150,0x4e);
    auVar150 = vminps_avx(auVar150,auVar13);
    auVar150 = vcmpps_avx(auVar117,auVar150,0);
    auVar13 = _local_740 & auVar150;
    auVar117 = _local_740;
    if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0x7f,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0xbf,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0')
    {
      auVar117 = vandps_avx(auVar150,_local_740);
    }
    uVar98 = *(ulong *)pauVar93[2];
    auVar116._8_8_ = 0;
    auVar116._0_8_ = uVar98;
    uVar95 = vmovmskps_avx(auVar117);
    iVar96 = 0;
    for (; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x80000000) {
      iVar96 = iVar96 + 1;
    }
    *(undefined4 *)(local_740 + (uint)(iVar96 << 2)) = 0;
    uVar95 = ~uVar94;
    if ((((((((_local_740 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_740 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_740 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_740 >> 0x7f,0) != '\0') ||
          (_local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_740 >> 0xbf,0) != '\0') ||
        (_local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_740[0x1f] < '\0') {
      uVar95 = -uVar94;
    }
    uVar97 = (ulong)uVar95;
    local_be8 = *(int *)(pauVar93[2] + 8);
    *pauVar93 = _local_740;
    uVar103 = (undefined4)uVar98;
    auVar152._4_4_ = uVar103;
    auVar152._0_4_ = uVar103;
    auVar152._8_4_ = uVar103;
    auVar152._12_4_ = uVar103;
    auVar152._16_4_ = uVar103;
    auVar152._20_4_ = uVar103;
    auVar152._24_4_ = uVar103;
    auVar152._28_4_ = uVar103;
    auVar3 = vmovshdup_avx(auVar116);
    auVar3 = vsubps_avx(auVar3,auVar116);
    auVar128._0_4_ = auVar3._0_4_;
    auVar128._4_4_ = auVar128._0_4_;
    auVar128._8_4_ = auVar128._0_4_;
    auVar128._12_4_ = auVar128._0_4_;
    auVar128._16_4_ = auVar128._0_4_;
    auVar128._20_4_ = auVar128._0_4_;
    auVar128._24_4_ = auVar128._0_4_;
    auVar128._28_4_ = auVar128._0_4_;
    auVar3 = vfmadd132ps_fma(auVar128,auVar152,_DAT_01faff20);
    local_3e0 = ZEXT1632(auVar3);
    local_570._8_8_ = 0;
    local_570._0_8_ = *(ulong *)(local_3e0 + (uint)(iVar96 << 2));
  } while( true );
LAB_0182cfb4:
  if (bVar99 != false) {
    return bVar99;
  }
  uVar103 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar129._4_4_ = uVar103;
  auVar129._0_4_ = uVar103;
  auVar129._8_4_ = uVar103;
  auVar129._12_4_ = uVar103;
  auVar129._16_4_ = uVar103;
  auVar129._20_4_ = uVar103;
  auVar129._24_4_ = uVar103;
  auVar129._28_4_ = uVar103;
  auVar117 = vcmpps_avx(local_320,auVar129,2);
  uVar92 = vmovmskps_avx(auVar117);
  uVar92 = (uint)local_8a8 & uVar92;
  if (uVar92 == 0) {
    return false;
  }
  goto LAB_0182a7ab;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }